

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::UnaryOp_x86_fma::forward_inplace(UnaryOp_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  float *pfVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  undefined1 (*pauVar16) [32];
  undefined1 (*pauVar17) [16];
  uint uVar18;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar19;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar34 [16];
  undefined1 auVar56 [32];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined1 auVar59 [64];
  undefined1 auVar95 [56];
  undefined1 auVar60 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar41 [32];
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dd_09;
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dd_10;
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar42 [32];
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Dc_11;
  undefined4 extraout_XMM0_Dc_12;
  undefined4 extraout_XMM0_Dc_13;
  undefined4 extraout_XMM0_Dc_14;
  undefined4 extraout_XMM0_Dc_15;
  undefined4 extraout_XMM0_Dc_16;
  undefined4 extraout_XMM0_Dc_17;
  undefined4 extraout_XMM0_Dd_11;
  undefined4 extraout_XMM0_Dd_12;
  undefined4 extraout_XMM0_Dd_13;
  undefined4 extraout_XMM0_Dd_14;
  undefined4 extraout_XMM0_Dd_15;
  undefined4 extraout_XMM0_Dd_16;
  undefined4 extraout_XMM0_Dd_17;
  undefined1 auVar67 [64];
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Dc_18;
  undefined4 extraout_XMM0_Dc_19;
  undefined4 extraout_XMM0_Dc_20;
  undefined4 extraout_XMM0_Dd_18;
  undefined4 extraout_XMM0_Dd_19;
  undefined4 extraout_XMM0_Dd_20;
  undefined1 auVar68 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar43 [32];
  undefined4 extraout_XMM0_Db_21;
  undefined4 extraout_XMM0_Dc_21;
  undefined4 extraout_XMM0_Dd_21;
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined4 extraout_XMM0_Db_22;
  undefined4 extraout_XMM0_Dc_22;
  undefined4 extraout_XMM0_Dd_22;
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar46 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined4 extraout_XMM0_Db_23;
  undefined4 extraout_XMM0_Dc_23;
  undefined4 extraout_XMM0_Dd_23;
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined4 extraout_XMM0_Db_24;
  undefined4 extraout_XMM0_Dc_24;
  undefined4 extraout_XMM0_Dd_24;
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined4 extraout_XMM0_Db_25;
  undefined4 extraout_XMM0_Db_26;
  undefined4 extraout_XMM0_Db_27;
  undefined4 extraout_XMM0_Db_28;
  undefined4 extraout_XMM0_Db_29;
  undefined4 extraout_XMM0_Db_30;
  undefined4 extraout_XMM0_Db_31;
  undefined4 extraout_XMM0_Dc_25;
  undefined4 extraout_XMM0_Dc_26;
  undefined4 extraout_XMM0_Dc_27;
  undefined4 extraout_XMM0_Dc_28;
  undefined4 extraout_XMM0_Dc_29;
  undefined4 extraout_XMM0_Dc_30;
  undefined4 extraout_XMM0_Dc_31;
  undefined4 extraout_XMM0_Dd_25;
  undefined4 extraout_XMM0_Dd_26;
  undefined4 extraout_XMM0_Dd_27;
  undefined4 extraout_XMM0_Dd_28;
  undefined4 extraout_XMM0_Dd_29;
  undefined4 extraout_XMM0_Dd_30;
  undefined4 extraout_XMM0_Dd_31;
  undefined1 auVar81 [64];
  undefined4 extraout_XMM0_Db_32;
  undefined4 extraout_XMM0_Db_33;
  undefined4 extraout_XMM0_Db_34;
  undefined4 extraout_XMM0_Dc_32;
  undefined4 extraout_XMM0_Dc_33;
  undefined4 extraout_XMM0_Dc_34;
  undefined4 extraout_XMM0_Dd_32;
  undefined4 extraout_XMM0_Dd_33;
  undefined4 extraout_XMM0_Dd_34;
  undefined1 auVar82 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar52 [32];
  undefined4 extraout_XMM0_Db_35;
  undefined4 extraout_XMM0_Dc_35;
  undefined4 extraout_XMM0_Dd_35;
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined4 extraout_XMM0_Db_36;
  undefined4 extraout_XMM0_Dc_36;
  undefined4 extraout_XMM0_Dd_36;
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar55 [32];
  undefined4 extraout_XMM0_Db_37;
  undefined4 extraout_XMM0_Dc_37;
  undefined4 extraout_XMM0_Dd_37;
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined4 extraout_XMM0_Db_38;
  undefined4 extraout_XMM0_Dc_38;
  undefined4 extraout_XMM0_Dd_38;
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar270 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar271 [32];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 in_ZMM11 [64];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar310 [32];
  undefined1 auVar309 [16];
  undefined1 in_ZMM14 [64];
  undefined1 auVar311 [64];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  __m128 afVar324;
  unary_op_tan op;
  __m256 _p;
  unary_op_tan local_151;
  undefined1 local_150 [16];
  undefined1 local_140 [8];
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined8 local_128;
  undefined1 local_120 [16];
  undefined8 local_110;
  Mat *local_108;
  undefined1 local_100 [32];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  long local_60;
  undefined1 auVar37 [32];
  undefined1 auVar47 [32];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  undefined1 extraout_var_06 [60];
  undefined1 extraout_var_07 [60];
  undefined1 extraout_var_08 [60];
  undefined1 extraout_var_09 [60];
  undefined1 extraout_var_10 [60];
  undefined1 extraout_var_11 [60];
  undefined1 extraout_var_12 [60];
  undefined1 extraout_var_13 [60];
  undefined1 extraout_var_14 [60];
  undefined1 extraout_var_15 [60];
  undefined1 extraout_var_16 [60];
  undefined1 extraout_var_17 [60];
  undefined1 extraout_var_18 [60];
  undefined1 extraout_var_19 [60];
  undefined1 extraout_var_20 [60];
  undefined1 extraout_var_21 [60];
  undefined1 extraout_var_22 [60];
  undefined1 extraout_var_23 [60];
  undefined1 extraout_var_24 [60];
  undefined1 extraout_var_25 [60];
  undefined1 extraout_var_26 [60];
  undefined1 extraout_var_27 [60];
  undefined1 extraout_var_28 [60];
  undefined1 extraout_var_29 [60];
  undefined1 extraout_var_30 [60];
  undefined1 extraout_var_31 [60];
  undefined1 extraout_var_32 [60];
  undefined1 extraout_var_33 [60];
  undefined1 extraout_var_34 [60];
  
  auVar46 = _DAT_0054ed20;
  auVar37 = _DAT_0054ed00;
  auVar20 = in_ZMM3._0_16_;
  auVar97 = in_ZMM5._0_16_;
  local_108 = bottom_top_blob;
  switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_UnaryOp_x86_fma[-3])) {
  case 0:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar15 = 0;
      auVar96._8_4_ = 0x7fffffff;
      auVar96._0_8_ = 0x7fffffff7fffffff;
      auVar96._12_4_ = 0x7fffffff;
      auVar144._8_8_ = 0x8000000000000000;
      auVar144._0_8_ = 0x8000000000000000;
      auVar20 = vpcmpeqd_avx(auVar97,auVar97);
      auVar196._8_4_ = 0x7fffffff;
      auVar196._0_8_ = 0x7fffffff7fffffff;
      auVar196._12_4_ = 0x7fffffff;
      auVar196._16_4_ = 0x7fffffff;
      auVar196._20_4_ = 0x7fffffff;
      auVar196._24_4_ = 0x7fffffff;
      auVar196._28_4_ = 0x7fffffff;
      do {
        pauVar16 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar18 < 8) {
          uVar8 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar127 = *pauVar16;
            auVar230._0_8_ = auVar127._0_8_ ^ 0x8000000080000000;
            auVar230._8_4_ = auVar127._8_4_ ^ 0x80000000;
            auVar230._12_4_ = auVar127._12_4_ ^ 0x80000000;
            auVar230._16_4_ = auVar127._16_4_ ^ 0x80000000;
            auVar230._20_4_ = auVar127._20_4_ ^ 0x80000000;
            auVar230._24_4_ = auVar127._24_4_ ^ 0x80000000;
            auVar230._28_4_ = auVar127._28_4_ ^ 0x80000000;
            auVar127 = vmaxps_avx(auVar230,auVar127);
            *pauVar16 = auVar127;
            pauVar16 = pauVar16 + 1;
            iVar13 = iVar13 + 8;
            uVar8 = uVar18 & 0xfffffff8;
          } while (iVar13 < (int)uVar18);
        }
        uVar10 = uVar8 | 3;
        while ((int)uVar10 < (int)uVar18) {
          auVar97 = vandps_avx(auVar96,*(undefined1 (*) [16])*pauVar16);
          *(undefined1 (*) [16])*pauVar16 = auVar97;
          pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
          uVar10 = uVar8 + 7;
          uVar8 = uVar8 + 4;
        }
        if ((int)uVar8 < (int)uVar18) {
          uVar9 = CONCAT44(0,~uVar8 + uVar18);
          auVar202._8_8_ = 0;
          auVar202._0_8_ = uVar9;
          auVar174 = vpshufd_avx(auVar202,0x44);
          auVar97 = vorps_avx(auVar174,auVar144);
          auVar108 = vorps_avx(auVar174,auVar144);
          auVar174 = vorps_avx(auVar174,auVar144);
          uVar14 = 0;
          do {
            auVar258._8_8_ = 0;
            auVar258._0_8_ = uVar14;
            auVar222 = vpshufd_avx(auVar258,0x44);
            auVar267._16_16_ = auVar222;
            auVar267._0_16_ = auVar222;
            auVar127 = vorps_avx(auVar267,auVar37);
            auVar140 = vorps_avx(auVar267,auVar46);
            auVar286._0_8_ = auVar140._16_8_ ^ 0x8000000000000000;
            auVar286._8_4_ = auVar140._24_4_;
            auVar286._12_4_ = auVar140._28_4_ ^ 0x80000000;
            auVar222 = vpcmpgtq_avx(auVar286,auVar97);
            auVar259._0_8_ = auVar140._0_8_ ^ 0x8000000000000000;
            auVar259._8_4_ = auVar140._8_4_;
            auVar259._12_4_ = auVar140._12_4_ ^ 0x80000000;
            auVar232 = vpcmpgtq_avx(auVar259,auVar108);
            auVar222 = vpackssdw_avx(auVar232,auVar222);
            auVar287._0_8_ = auVar127._16_8_ ^ 0x8000000000000000;
            auVar287._8_4_ = auVar127._24_4_;
            auVar287._12_4_ = auVar127._28_4_ ^ 0x80000000;
            auVar232 = vpcmpgtq_avx(auVar287,auVar97);
            auVar272._0_8_ = auVar127._0_8_ ^ 0x8000000000000000;
            auVar272._8_4_ = auVar127._8_4_;
            auVar272._12_4_ = auVar127._12_4_ ^ 0x80000000;
            auVar260 = vpcmpgtq_avx(auVar272,auVar174);
            auVar232 = vpackssdw_avx(auVar260,auVar232);
            auVar222 = vpackssdw_avx(auVar232 ^ auVar20,auVar222 ^ auVar20);
            auVar232 = vpmovsxwd_avx(auVar222);
            auVar222 = vpunpckhwd_avx(auVar222,auVar222);
            auVar268._16_16_ = auVar222;
            auVar268._0_16_ = auVar232;
            auVar127 = vmaskmovps_avx(auVar268,*(undefined1 (*) [32])(*pauVar16 + uVar14 * 4));
            auVar127 = vandps_avx(auVar127,auVar196);
            auVar127 = vmaskmovps_avx(auVar268,auVar127);
            *(undefined1 (*) [32])(*pauVar16 + uVar14 * 4) = auVar127;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar7);
    }
    break;
  case 1:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar15 = 0;
      auVar154._8_8_ = 0x8000000000000000;
      auVar154._0_8_ = 0x8000000000000000;
      auVar20 = vpcmpeqd_avx(auVar97,auVar97);
      do {
        pauVar16 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar18 < 8) {
          uVar8 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar127 = *pauVar16;
            auVar199._0_8_ = auVar127._0_8_ ^ 0x8000000080000000;
            auVar199._8_4_ = auVar127._8_4_ ^ 0x80000000;
            auVar199._12_4_ = auVar127._12_4_ ^ 0x80000000;
            auVar199._16_4_ = auVar127._16_4_ ^ 0x80000000;
            auVar199._20_4_ = auVar127._20_4_ ^ 0x80000000;
            auVar199._24_4_ = auVar127._24_4_ ^ 0x80000000;
            auVar199._28_4_ = auVar127._28_4_ ^ 0x80000000;
            *pauVar16 = auVar199;
            pauVar16 = pauVar16 + 1;
            iVar13 = iVar13 + 8;
            uVar8 = uVar18 & 0xfffffff8;
          } while (iVar13 < (int)uVar18);
        }
        uVar10 = uVar8 | 3;
        while ((int)uVar10 < (int)uVar18) {
          auVar97 = *(undefined1 (*) [16])*pauVar16;
          auVar190._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
          auVar190._8_4_ = auVar97._8_4_ ^ 0x80000000;
          auVar190._12_4_ = auVar97._12_4_ ^ 0x80000000;
          *(undefined1 (*) [16])*pauVar16 = auVar190;
          pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
          uVar10 = uVar8 + 7;
          uVar8 = uVar8 + 4;
        }
        if ((int)uVar8 < (int)uVar18) {
          uVar9 = CONCAT44(0,~uVar8 + uVar18);
          auVar191._8_8_ = 0;
          auVar191._0_8_ = uVar9;
          auVar174 = vpshufd_avx(auVar191,0x44);
          auVar97 = vorps_avx(auVar174,auVar154);
          auVar108 = vorps_avx(auVar174,auVar154);
          auVar174 = vorps_avx(auVar174,auVar154);
          uVar14 = 0;
          do {
            auVar243._8_8_ = 0;
            auVar243._0_8_ = uVar14;
            auVar222 = vpshufd_avx(auVar243,0x44);
            auVar253._16_16_ = auVar222;
            auVar253._0_16_ = auVar222;
            auVar127 = vorps_avx(auVar253,auVar37);
            auVar140 = vorps_avx(auVar253,auVar46);
            auVar278._0_8_ = auVar140._16_8_ ^ 0x8000000000000000;
            auVar278._8_4_ = auVar140._24_4_;
            auVar278._12_4_ = auVar140._28_4_ ^ 0x80000000;
            auVar222 = vpcmpgtq_avx(auVar278,auVar97);
            auVar244._0_8_ = auVar140._0_8_ ^ 0x8000000000000000;
            auVar244._8_4_ = auVar140._8_4_;
            auVar244._12_4_ = auVar140._12_4_ ^ 0x80000000;
            auVar232 = vpcmpgtq_avx(auVar244,auVar108);
            auVar222 = vpackssdw_avx(auVar232,auVar222);
            auVar279._0_8_ = auVar127._16_8_ ^ 0x8000000000000000;
            auVar279._8_4_ = auVar127._24_4_;
            auVar279._12_4_ = auVar127._28_4_ ^ 0x80000000;
            auVar232 = vpcmpgtq_avx(auVar279,auVar97);
            auVar264._0_8_ = auVar127._0_8_ ^ 0x8000000000000000;
            auVar264._8_4_ = auVar127._8_4_;
            auVar264._12_4_ = auVar127._12_4_ ^ 0x80000000;
            auVar260 = vpcmpgtq_avx(auVar264,auVar174);
            auVar232 = vpackssdw_avx(auVar260,auVar232);
            auVar222 = vpackssdw_avx(auVar232 ^ auVar20,auVar222 ^ auVar20);
            auVar232 = vpmovsxwd_avx(auVar222);
            auVar222 = vpunpckhwd_avx(auVar222,auVar222);
            auVar254._16_16_ = auVar222;
            auVar254._0_16_ = auVar232;
            auVar127 = vmaskmovps_avx(auVar254,*(undefined1 (*) [32])(*pauVar16 + uVar14 * 4));
            auVar270._0_8_ = auVar127._0_8_ ^ 0x8000000080000000;
            auVar270._8_4_ = auVar127._8_4_ ^ 0x80000000;
            auVar270._12_4_ = auVar127._12_4_ ^ 0x80000000;
            auVar270._16_4_ = auVar127._16_4_ ^ 0x80000000;
            auVar270._20_4_ = auVar127._20_4_ ^ 0x80000000;
            auVar270._24_4_ = auVar127._24_4_ ^ 0x80000000;
            auVar270._28_4_ = auVar127._28_4_ ^ 0x80000000;
            auVar127 = vmaskmovps_avx(auVar254,auVar270);
            *(undefined1 (*) [32])(*pauVar16 + uVar14 * 4) = auVar127;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar7);
    }
    break;
  case 2:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar15 = 0;
      auVar117._8_8_ = 0x8000000000000000;
      auVar117._0_8_ = 0x8000000000000000;
      auVar20 = vpcmpeqd_avx(auVar20,auVar20);
      do {
        pauVar16 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar18 < 8) {
          uVar8 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar127 = vroundps_avx(*pauVar16,1);
            *pauVar16 = auVar127;
            pauVar16 = pauVar16 + 1;
            iVar13 = iVar13 + 8;
            uVar8 = uVar18 & 0xfffffff8;
          } while (iVar13 < (int)uVar18);
        }
        uVar10 = uVar8 | 3;
        while ((int)uVar10 < (int)uVar18) {
          auVar97 = vroundps_avx(*(undefined1 (*) [16])*pauVar16,1);
          *(undefined1 (*) [16])*pauVar16 = auVar97;
          pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
          uVar10 = uVar8 + 7;
          uVar8 = uVar8 + 4;
        }
        if ((int)uVar8 < (int)uVar18) {
          uVar9 = CONCAT44(0,~uVar8 + uVar18);
          auVar149._8_8_ = 0;
          auVar149._0_8_ = uVar9;
          auVar174 = vpshufd_avx(auVar149,0x44);
          auVar97 = vorps_avx(auVar174,auVar117);
          auVar108 = vorps_avx(auVar174,auVar117);
          auVar174 = vorps_avx(auVar174,auVar117);
          uVar14 = 0;
          do {
            auVar206._8_8_ = 0;
            auVar206._0_8_ = uVar14;
            auVar222 = vpshufd_avx(auVar206,0x44);
            auVar216._16_16_ = auVar222;
            auVar216._0_16_ = auVar222;
            auVar127 = vorps_avx(auVar216,auVar37);
            auVar140 = vorps_avx(auVar216,auVar46);
            auVar236._0_8_ = auVar140._16_8_ ^ 0x8000000000000000;
            auVar236._8_4_ = auVar140._24_4_;
            auVar236._12_4_ = auVar140._28_4_ ^ 0x80000000;
            auVar222 = vpcmpgtq_avx(auVar236,auVar97);
            auVar207._0_8_ = auVar140._0_8_ ^ 0x8000000000000000;
            auVar207._8_4_ = auVar140._8_4_;
            auVar207._12_4_ = auVar140._12_4_ ^ 0x80000000;
            auVar232 = vpcmpgtq_avx(auVar207,auVar108);
            auVar222 = vpackssdw_avx(auVar232,auVar222);
            auVar237._0_8_ = auVar127._16_8_ ^ 0x8000000000000000;
            auVar237._8_4_ = auVar127._24_4_;
            auVar237._12_4_ = auVar127._28_4_ ^ 0x80000000;
            auVar232 = vpcmpgtq_avx(auVar237,auVar97);
            auVar224._0_8_ = auVar127._0_8_ ^ 0x8000000000000000;
            auVar224._8_4_ = auVar127._8_4_;
            auVar224._12_4_ = auVar127._12_4_ ^ 0x80000000;
            auVar260 = vpcmpgtq_avx(auVar224,auVar174);
            auVar232 = vpackssdw_avx(auVar260,auVar232);
            auVar222 = vpackssdw_avx(auVar232 ^ auVar20,auVar222 ^ auVar20);
            auVar232 = vpmovsxwd_avx(auVar222);
            auVar222 = vpunpckhwd_avx(auVar222,auVar222);
            auVar217._16_16_ = auVar222;
            auVar217._0_16_ = auVar232;
            auVar127 = vmaskmovps_avx(auVar217,*(undefined1 (*) [32])(*pauVar16 + uVar14 * 4));
            auVar127 = vroundps_avx(auVar127,9);
            auVar127 = vmaskmovps_avx(auVar217,auVar127);
            *(undefined1 (*) [32])(*pauVar16 + uVar14 * 4) = auVar127;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar7);
    }
    break;
  case 3:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar15 = 0;
      auVar118._8_8_ = 0x8000000000000000;
      auVar118._0_8_ = 0x8000000000000000;
      auVar20 = vpcmpeqd_avx(auVar20,auVar20);
      do {
        pauVar16 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar18 < 8) {
          uVar8 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar127 = vroundps_avx(*pauVar16,2);
            *pauVar16 = auVar127;
            pauVar16 = pauVar16 + 1;
            iVar13 = iVar13 + 8;
            uVar8 = uVar18 & 0xfffffff8;
          } while (iVar13 < (int)uVar18);
        }
        uVar10 = uVar8 | 3;
        while ((int)uVar10 < (int)uVar18) {
          auVar97 = vroundps_avx(*(undefined1 (*) [16])*pauVar16,2);
          *(undefined1 (*) [16])*pauVar16 = auVar97;
          pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
          uVar10 = uVar8 + 7;
          uVar8 = uVar8 + 4;
        }
        if ((int)uVar8 < (int)uVar18) {
          uVar9 = CONCAT44(0,~uVar8 + uVar18);
          auVar151._8_8_ = 0;
          auVar151._0_8_ = uVar9;
          auVar174 = vpshufd_avx(auVar151,0x44);
          auVar97 = vorps_avx(auVar174,auVar118);
          auVar108 = vorps_avx(auVar174,auVar118);
          auVar174 = vorps_avx(auVar174,auVar118);
          uVar14 = 0;
          do {
            auVar208._8_8_ = 0;
            auVar208._0_8_ = uVar14;
            auVar222 = vpshufd_avx(auVar208,0x44);
            auVar218._16_16_ = auVar222;
            auVar218._0_16_ = auVar222;
            auVar127 = vorps_avx(auVar218,auVar37);
            auVar140 = vorps_avx(auVar218,auVar46);
            auVar240._0_8_ = auVar140._16_8_ ^ 0x8000000000000000;
            auVar240._8_4_ = auVar140._24_4_;
            auVar240._12_4_ = auVar140._28_4_ ^ 0x80000000;
            auVar222 = vpcmpgtq_avx(auVar240,auVar97);
            auVar209._0_8_ = auVar140._0_8_ ^ 0x8000000000000000;
            auVar209._8_4_ = auVar140._8_4_;
            auVar209._12_4_ = auVar140._12_4_ ^ 0x80000000;
            auVar232 = vpcmpgtq_avx(auVar209,auVar108);
            auVar222 = vpackssdw_avx(auVar232,auVar222);
            auVar241._0_8_ = auVar127._16_8_ ^ 0x8000000000000000;
            auVar241._8_4_ = auVar127._24_4_;
            auVar241._12_4_ = auVar127._28_4_ ^ 0x80000000;
            auVar232 = vpcmpgtq_avx(auVar241,auVar97);
            auVar225._0_8_ = auVar127._0_8_ ^ 0x8000000000000000;
            auVar225._8_4_ = auVar127._8_4_;
            auVar225._12_4_ = auVar127._12_4_ ^ 0x80000000;
            auVar260 = vpcmpgtq_avx(auVar225,auVar174);
            auVar232 = vpackssdw_avx(auVar260,auVar232);
            auVar222 = vpackssdw_avx(auVar232 ^ auVar20,auVar222 ^ auVar20);
            auVar232 = vpmovsxwd_avx(auVar222);
            auVar222 = vpunpckhwd_avx(auVar222,auVar222);
            auVar219._16_16_ = auVar222;
            auVar219._0_16_ = auVar232;
            auVar127 = vmaskmovps_avx(auVar219,*(undefined1 (*) [32])(*pauVar16 + uVar14 * 4));
            auVar127 = vroundps_avx(auVar127,10);
            auVar127 = vmaskmovps_avx(auVar219,auVar127);
            *(undefined1 (*) [32])(*pauVar16 + uVar14 * 4) = auVar127;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar7);
    }
    break;
  case 4:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar15 = 0;
      auVar116._8_8_ = 0x8000000000000000;
      auVar116._0_8_ = 0x8000000000000000;
      auVar20 = vpcmpeqd_avx(auVar20,auVar20);
      do {
        pauVar16 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar18 < 8) {
          uVar8 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar2._4_4_ = *(float *)(*pauVar16 + 4) * *(float *)(*pauVar16 + 4);
            auVar2._0_4_ = *(float *)*pauVar16 * *(float *)*pauVar16;
            auVar2._8_4_ = *(float *)(*pauVar16 + 8) * *(float *)(*pauVar16 + 8);
            auVar2._12_4_ = *(float *)(*pauVar16 + 0xc) * *(float *)(*pauVar16 + 0xc);
            auVar2._16_4_ = *(float *)(*pauVar16 + 0x10) * *(float *)(*pauVar16 + 0x10);
            auVar2._20_4_ = *(float *)(*pauVar16 + 0x14) * *(float *)(*pauVar16 + 0x14);
            auVar2._24_4_ = *(float *)(*pauVar16 + 0x18) * *(float *)(*pauVar16 + 0x18);
            auVar2._28_4_ = *(undefined4 *)(*pauVar16 + 0x1c);
            *pauVar16 = auVar2;
            pauVar16 = pauVar16 + 1;
            iVar13 = iVar13 + 8;
            uVar8 = uVar18 & 0xfffffff8;
          } while (iVar13 < (int)uVar18);
        }
        uVar10 = uVar8 | 3;
        while ((int)uVar10 < (int)uVar18) {
          auVar145._0_4_ = *(float *)*pauVar16 * *(float *)*pauVar16;
          auVar145._4_4_ = *(float *)(*pauVar16 + 4) * *(float *)(*pauVar16 + 4);
          auVar145._8_4_ = *(float *)(*pauVar16 + 8) * *(float *)(*pauVar16 + 8);
          auVar145._12_4_ = *(float *)(*pauVar16 + 0xc) * *(float *)(*pauVar16 + 0xc);
          *(undefined1 (*) [16])*pauVar16 = auVar145;
          pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
          uVar10 = uVar8 + 7;
          uVar8 = uVar8 + 4;
        }
        if ((int)uVar8 < (int)uVar18) {
          uVar9 = CONCAT44(0,~uVar8 + uVar18);
          auVar146._8_8_ = 0;
          auVar146._0_8_ = uVar9;
          auVar174 = vpshufd_avx(auVar146,0x44);
          auVar97 = vorps_avx(auVar174,auVar116);
          auVar108 = vorps_avx(auVar174,auVar116);
          auVar174 = vorps_avx(auVar174,auVar116);
          uVar14 = 0;
          do {
            auVar203._8_8_ = 0;
            auVar203._0_8_ = uVar14;
            auVar222 = vpshufd_avx(auVar203,0x44);
            auVar214._16_16_ = auVar222;
            auVar214._0_16_ = auVar222;
            auVar127 = vorps_avx(auVar214,auVar37);
            auVar140 = vorps_avx(auVar214,auVar46);
            auVar233._0_8_ = auVar140._16_8_ ^ 0x8000000000000000;
            auVar233._8_4_ = auVar140._24_4_;
            auVar233._12_4_ = auVar140._28_4_ ^ 0x80000000;
            auVar222 = vpcmpgtq_avx(auVar233,auVar97);
            auVar204._0_8_ = auVar140._0_8_ ^ 0x8000000000000000;
            auVar204._8_4_ = auVar140._8_4_;
            auVar204._12_4_ = auVar140._12_4_ ^ 0x80000000;
            auVar232 = vpcmpgtq_avx(auVar204,auVar108);
            auVar222 = vpackssdw_avx(auVar232,auVar222);
            auVar234._0_8_ = auVar127._16_8_ ^ 0x8000000000000000;
            auVar234._8_4_ = auVar127._24_4_;
            auVar234._12_4_ = auVar127._28_4_ ^ 0x80000000;
            auVar232 = vpcmpgtq_avx(auVar234,auVar97);
            auVar223._0_8_ = auVar127._0_8_ ^ 0x8000000000000000;
            auVar223._8_4_ = auVar127._8_4_;
            auVar223._12_4_ = auVar127._12_4_ ^ 0x80000000;
            auVar260 = vpcmpgtq_avx(auVar223,auVar174);
            auVar232 = vpackssdw_avx(auVar260,auVar232);
            auVar222 = vpackssdw_avx(auVar232 ^ auVar20,auVar222 ^ auVar20);
            auVar232 = vpmovsxwd_avx(auVar222);
            auVar222 = vpunpckhwd_avx(auVar222,auVar222);
            auVar215._16_16_ = auVar222;
            auVar215._0_16_ = auVar232;
            auVar127 = vmaskmovps_avx(auVar215,*(undefined1 (*) [32])(*pauVar16 + uVar14 * 4));
            auVar3._4_4_ = auVar127._4_4_ * auVar127._4_4_;
            auVar3._0_4_ = auVar127._0_4_ * auVar127._0_4_;
            auVar3._8_4_ = auVar127._8_4_ * auVar127._8_4_;
            auVar3._12_4_ = auVar127._12_4_ * auVar127._12_4_;
            auVar3._16_4_ = auVar127._16_4_ * auVar127._16_4_;
            auVar3._20_4_ = auVar127._20_4_ * auVar127._20_4_;
            auVar3._24_4_ = auVar127._24_4_ * auVar127._24_4_;
            auVar3._28_4_ = auVar127._28_4_;
            auVar127 = vmaskmovps_avx(auVar215,auVar3);
            *(undefined1 (*) [32])(*pauVar16 + uVar14 * 4) = auVar127;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar7);
    }
    break;
  case 5:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar15 = 0;
      auVar51._8_4_ = 0xc0400000;
      auVar51._0_8_ = 0xc0400000c0400000;
      auVar51._12_4_ = 0xc0400000;
      auVar51._16_4_ = 0xc0400000;
      auVar51._20_4_ = 0xc0400000;
      auVar51._24_4_ = 0xc0400000;
      auVar51._28_4_ = 0xc0400000;
      auVar129._8_4_ = 0x7fffffff;
      auVar129._0_8_ = 0x7fffffff7fffffff;
      auVar129._12_4_ = 0x7fffffff;
      auVar129._16_4_ = 0x7fffffff;
      auVar129._20_4_ = 0x7fffffff;
      auVar129._24_4_ = 0x7fffffff;
      auVar129._28_4_ = 0x7fffffff;
      auVar142._8_4_ = 0x800000;
      auVar142._0_8_ = 0x80000000800000;
      auVar142._12_4_ = 0x800000;
      auVar142._16_4_ = 0x800000;
      auVar142._20_4_ = 0x800000;
      auVar142._24_4_ = 0x800000;
      auVar142._28_4_ = 0x800000;
      auVar211._8_4_ = 0x800000;
      auVar211._0_8_ = 0x80000000800000;
      auVar211._12_4_ = 0x800000;
      auVar265._8_8_ = 0x8000000000000000;
      auVar265._0_8_ = 0x8000000000000000;
      auVar20 = vpcmpeqd_avx(in_ZMM11._0_16_,in_ZMM11._0_16_);
      do {
        auVar315._8_4_ = 0xc0400000;
        auVar315._0_8_ = 0xc0400000c0400000;
        auVar315._12_4_ = 0xc0400000;
        pauVar16 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar18 < 8) {
          uVar8 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar127 = *pauVar16;
            auVar140 = vrsqrtps_avx(auVar127);
            auVar311._0_4_ = auVar127._0_4_ * auVar140._0_4_;
            auVar311._4_4_ = auVar127._4_4_ * auVar140._4_4_;
            auVar311._8_4_ = auVar127._8_4_ * auVar140._8_4_;
            auVar311._12_4_ = auVar127._12_4_ * auVar140._12_4_;
            auVar311._16_4_ = auVar127._16_4_ * auVar140._16_4_;
            auVar311._20_4_ = auVar127._20_4_ * auVar140._20_4_;
            auVar311._28_36_ = in_ZMM14._28_36_;
            auVar311._24_4_ = auVar127._24_4_ * auVar140._24_4_;
            auVar97 = vfmadd213ps_fma(auVar140,auVar311._0_32_,auVar51);
            in_ZMM14 = ZEXT3264(CONCAT428(in_ZMM14._28_4_,
                                          CONCAT424(auVar311._24_4_ * -0.5,
                                                    CONCAT420(auVar311._20_4_ * -0.5,
                                                              CONCAT416(auVar311._16_4_ * -0.5,
                                                                        CONCAT412(auVar311._12_4_ *
                                                                                  -0.5,CONCAT48(
                                                  auVar311._8_4_ * -0.5,
                                                  CONCAT44(auVar311._4_4_ * -0.5,
                                                           auVar311._0_4_ * -0.5))))))));
            auVar303._0_4_ = auVar311._0_4_ * -0.5 * auVar97._0_4_;
            auVar303._4_4_ = auVar311._4_4_ * -0.5 * auVar97._4_4_;
            auVar303._8_4_ = auVar311._8_4_ * -0.5 * auVar97._8_4_;
            auVar303._12_4_ = auVar311._12_4_ * -0.5 * auVar97._12_4_;
            auVar303._16_4_ = auVar311._16_4_ * -0.5 * 0.0;
            auVar303._20_4_ = auVar311._20_4_ * -0.5 * 0.0;
            auVar303._24_4_ = auVar311._24_4_ * -0.5 * 0.0;
            auVar303._28_4_ = 0;
            auVar127 = vandps_avx(auVar127,auVar129);
            auVar127 = vcmpps_avx(auVar142,auVar127,2);
            auVar127 = vandps_avx(auVar127,auVar303);
            *pauVar16 = auVar127;
            pauVar16 = pauVar16 + 1;
            iVar13 = iVar13 + 8;
            uVar8 = uVar18 & 0xfffffff8;
          } while (iVar13 < (int)uVar18);
        }
        auVar298._8_4_ = 0x7fffffff;
        auVar298._0_8_ = 0x7fffffff7fffffff;
        auVar298._12_4_ = 0x7fffffff;
        uVar10 = uVar8 | 3;
        while ((int)uVar10 < (int)uVar18) {
          auVar97 = *(undefined1 (*) [16])*pauVar16;
          auVar108 = vrsqrtps_avx(auVar97);
          auVar192._0_4_ = auVar97._0_4_ * auVar108._0_4_;
          auVar192._4_4_ = auVar97._4_4_ * auVar108._4_4_;
          auVar192._8_4_ = auVar97._8_4_ * auVar108._8_4_;
          auVar192._12_4_ = auVar97._12_4_ * auVar108._12_4_;
          auVar108 = vfmadd213ps_fma(auVar108,auVar192,auVar315);
          in_ZMM6 = ZEXT1664(CONCAT412(auVar192._12_4_ * -0.5,
                                       CONCAT48(auVar192._8_4_ * -0.5,
                                                CONCAT44(auVar192._4_4_ * -0.5,auVar192._0_4_ * -0.5
                                                        ))));
          auVar178._0_4_ = auVar192._0_4_ * -0.5 * auVar108._0_4_;
          auVar178._4_4_ = auVar192._4_4_ * -0.5 * auVar108._4_4_;
          auVar178._8_4_ = auVar192._8_4_ * -0.5 * auVar108._8_4_;
          auVar178._12_4_ = auVar192._12_4_ * -0.5 * auVar108._12_4_;
          auVar97 = vandps_avx(auVar298,auVar97);
          auVar97 = vcmpps_avx(auVar211,auVar97,2);
          auVar97 = vandps_avx(auVar97,auVar178);
          *(undefined1 (*) [16])*pauVar16 = auVar97;
          pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
          uVar10 = uVar8 + 7;
          uVar8 = uVar8 + 4;
        }
        if ((int)uVar8 < (int)uVar18) {
          uVar9 = CONCAT44(0,~uVar8 + uVar18);
          auVar290._8_8_ = 0;
          auVar290._0_8_ = uVar9;
          auVar174 = vpshufd_avx(auVar290,0x44);
          auVar97 = vorps_avx(auVar174,auVar265);
          auVar108 = vorps_avx(auVar174,auVar265);
          auVar174 = vorps_avx(auVar174,auVar265);
          in_ZMM14 = ZEXT1664(auVar174);
          uVar14 = 0;
          do {
            auVar316._8_8_ = 0;
            auVar316._0_8_ = uVar14;
            auVar222 = vpshufd_avx(auVar316,0x44);
            auVar322._16_16_ = auVar222;
            auVar322._0_16_ = auVar222;
            auVar127 = vorps_avx(auVar322,auVar37);
            auVar140 = vorps_avx(auVar322,auVar46);
            auVar179._0_8_ = auVar140._16_8_ ^ 0x8000000000000000;
            auVar179._8_4_ = auVar140._24_4_;
            auVar179._12_4_ = auVar140._28_4_ ^ 0x80000000;
            auVar222 = vpcmpgtq_avx(auVar179,auVar97);
            auVar317._8_4_ = auVar140._8_4_;
            auVar317._0_8_ = auVar140._0_8_ ^ 0x8000000000000000;
            auVar317._12_4_ = auVar140._12_4_ ^ 0x80000000;
            auVar232 = vpcmpgtq_avx(auVar317,auVar108);
            auVar222 = vpackssdw_avx(auVar232,auVar222);
            auVar318._8_4_ = auVar127._24_4_;
            auVar318._0_8_ = auVar127._16_8_ ^ 0x8000000000000000;
            auVar318._12_4_ = auVar127._28_4_ ^ 0x80000000;
            auVar232 = vpcmpgtq_avx(auVar318,auVar97);
            auVar155._0_8_ = auVar127._0_8_ ^ 0x8000000000000000;
            auVar155._8_4_ = auVar127._8_4_;
            auVar155._12_4_ = auVar127._12_4_ ^ 0x80000000;
            auVar260 = vpcmpgtq_avx(auVar155,auVar174);
            auVar232 = vpackssdw_avx(auVar260,auVar232);
            auVar222 = vpackssdw_avx(auVar20 ^ auVar232,auVar20 ^ auVar222);
            auVar232 = vpmovsxwd_avx(auVar222);
            auVar222 = vpunpckhwd_avx(auVar222,auVar222);
            auVar167._16_16_ = auVar222;
            auVar167._0_16_ = auVar232;
            auVar140 = vmaskmovps_avx(auVar167,*(undefined1 (*) [32])(*pauVar16 + uVar14 * 4));
            auVar127 = vrsqrtps_avx(auVar140);
            auVar201._0_4_ = auVar127._0_4_ * auVar140._0_4_;
            auVar201._4_4_ = auVar127._4_4_ * auVar140._4_4_;
            auVar201._8_4_ = auVar127._8_4_ * auVar140._8_4_;
            auVar201._12_4_ = auVar127._12_4_ * auVar140._12_4_;
            auVar201._16_4_ = auVar127._16_4_ * auVar140._16_4_;
            auVar201._20_4_ = auVar127._20_4_ * auVar140._20_4_;
            auVar201._28_36_ = in_ZMM6._28_36_;
            auVar201._24_4_ = auVar127._24_4_ * auVar140._24_4_;
            auVar222 = vfmadd213ps_fma(auVar127,auVar201._0_32_,auVar51);
            auVar5._4_4_ = auVar222._4_4_ * auVar201._4_4_ * -0.5;
            auVar5._0_4_ = auVar222._0_4_ * auVar201._0_4_ * -0.5;
            auVar5._8_4_ = auVar222._8_4_ * auVar201._8_4_ * -0.5;
            auVar5._12_4_ = auVar222._12_4_ * auVar201._12_4_ * -0.5;
            auVar5._16_4_ = auVar201._16_4_ * -0.5 * 0.0;
            auVar5._20_4_ = auVar201._20_4_ * -0.5 * 0.0;
            auVar5._24_4_ = auVar201._24_4_ * -0.5 * 0.0;
            auVar5._28_4_ = in_ZMM6._28_4_;
            in_ZMM6 = ZEXT3264(auVar5);
            auVar127 = vandps_avx(auVar140,auVar129);
            auVar127 = vcmpps_avx(auVar142,auVar127,2);
            auVar127 = vandps_avx(auVar127,auVar5);
            auVar127 = vmaskmovps_avx(auVar167,auVar127);
            *(undefined1 (*) [32])(*pauVar16 + uVar14 * 4) = auVar127;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar7);
    }
    break;
  case 6:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar15 = 0;
      auVar121._8_8_ = 0x8000000000000000;
      auVar121._0_8_ = 0x8000000000000000;
      auVar20 = vpcmpeqd_avx(auVar20,auVar20);
      auVar168._8_4_ = 0xc0400000;
      auVar168._0_8_ = 0xc0400000c0400000;
      auVar168._12_4_ = 0xc0400000;
      auVar168._16_4_ = 0xc0400000;
      auVar168._20_4_ = 0xc0400000;
      auVar168._24_4_ = 0xc0400000;
      auVar168._28_4_ = 0xc0400000;
      do {
        pauVar16 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar18 < 8) {
          uVar8 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar127 = vrsqrtps_avx(*pauVar16);
            *pauVar16 = auVar127;
            pauVar16 = pauVar16 + 1;
            iVar13 = iVar13 + 8;
            uVar8 = uVar18 & 0xfffffff8;
          } while (iVar13 < (int)uVar18);
        }
        uVar10 = uVar8 | 3;
        while ((int)uVar10 < (int)uVar18) {
          auVar97 = vrsqrtps_avx(*(undefined1 (*) [16])*pauVar16);
          *(undefined1 (*) [16])*pauVar16 = auVar97;
          pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
          uVar10 = uVar8 + 7;
          uVar8 = uVar8 + 4;
        }
        if ((int)uVar8 < (int)uVar18) {
          uVar9 = CONCAT44(0,~uVar8 + uVar18);
          auVar193._8_8_ = 0;
          auVar193._0_8_ = uVar9;
          auVar174 = vpshufd_avx(auVar193,0x44);
          auVar97 = vorps_avx(auVar174,auVar121);
          auVar108 = vorps_avx(auVar174,auVar121);
          auVar174 = vorps_avx(auVar174,auVar121);
          uVar14 = 0;
          do {
            auVar245._8_8_ = 0;
            auVar245._0_8_ = uVar14;
            auVar222 = vpshufd_avx(auVar245,0x44);
            auVar255._16_16_ = auVar222;
            auVar255._0_16_ = auVar222;
            auVar127 = vorps_avx(auVar255,auVar37);
            auVar140 = vorps_avx(auVar255,auVar46);
            auVar280._0_8_ = auVar140._16_8_ ^ 0x8000000000000000;
            auVar280._8_4_ = auVar140._24_4_;
            auVar280._12_4_ = auVar140._28_4_ ^ 0x80000000;
            auVar222 = vpcmpgtq_avx(auVar280,auVar97);
            auVar246._0_8_ = auVar140._0_8_ ^ 0x8000000000000000;
            auVar246._8_4_ = auVar140._8_4_;
            auVar246._12_4_ = auVar140._12_4_ ^ 0x80000000;
            auVar232 = vpcmpgtq_avx(auVar246,auVar108);
            auVar222 = vpackssdw_avx(auVar232,auVar222);
            auVar281._0_8_ = auVar127._16_8_ ^ 0x8000000000000000;
            auVar281._8_4_ = auVar127._24_4_;
            auVar281._12_4_ = auVar127._28_4_ ^ 0x80000000;
            auVar232 = vpcmpgtq_avx(auVar281,auVar97);
            auVar266._0_8_ = auVar127._0_8_ ^ 0x8000000000000000;
            auVar266._8_4_ = auVar127._8_4_;
            auVar266._12_4_ = auVar127._12_4_ ^ 0x80000000;
            auVar260 = vpcmpgtq_avx(auVar266,auVar174);
            auVar232 = vpackssdw_avx(auVar260,auVar232);
            auVar222 = vpackssdw_avx(auVar232 ^ auVar20,auVar222 ^ auVar20);
            auVar232 = vpmovsxwd_avx(auVar222);
            auVar222 = vpunpckhwd_avx(auVar222,auVar222);
            auVar256._16_16_ = auVar222;
            auVar256._0_16_ = auVar232;
            auVar140 = vmaskmovps_avx(auVar256,*(undefined1 (*) [32])(*pauVar16 + uVar14 * 4));
            auVar127 = vrsqrtps_avx(auVar140);
            auVar6._4_4_ = auVar140._4_4_ * auVar127._4_4_;
            auVar6._0_4_ = auVar140._0_4_ * auVar127._0_4_;
            auVar6._8_4_ = auVar140._8_4_ * auVar127._8_4_;
            auVar6._12_4_ = auVar140._12_4_ * auVar127._12_4_;
            auVar6._16_4_ = auVar140._16_4_ * auVar127._16_4_;
            auVar6._20_4_ = auVar140._20_4_ * auVar127._20_4_;
            auVar6._24_4_ = auVar140._24_4_ * auVar127._24_4_;
            auVar6._28_4_ = auVar140._28_4_;
            auVar222 = vfmadd213ps_fma(auVar6,auVar127,auVar168);
            auVar271._0_4_ = auVar127._0_4_ * -0.5 * auVar222._0_4_;
            auVar271._4_4_ = auVar127._4_4_ * -0.5 * auVar222._4_4_;
            auVar271._8_4_ = auVar127._8_4_ * -0.5 * auVar222._8_4_;
            auVar271._12_4_ = auVar127._12_4_ * -0.5 * auVar222._12_4_;
            auVar271._16_4_ = auVar127._16_4_ * -0.5 * 0.0;
            auVar271._20_4_ = auVar127._20_4_ * -0.5 * 0.0;
            auVar271._24_4_ = auVar127._24_4_ * -0.5 * 0.0;
            auVar271._28_4_ = 0;
            auVar127 = vmaskmovps_avx(auVar256,auVar271);
            *(undefined1 (*) [32])(*pauVar16 + uVar14 * 4) = auVar127;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar7);
    }
    break;
  case 7:
    local_128 = (ulong)bottom_top_blob->c;
    if (0 < (long)local_128) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_110 = CONCAT44(local_110._4_4_,iVar7) & 0xfffffffffffffff8;
      lVar15 = 0;
      local_120._8_8_ = 0x8000000000000000;
      local_120._0_8_ = 0x8000000000000000;
      do {
        auVar321._8_4_ = 0x3e2aaaaa;
        auVar321._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar284._8_4_ = 0x395e8083;
        auVar284._0_8_ = 0x395e8083395e8083;
        auVar252._8_4_ = 0x3f318000;
        auVar252._0_8_ = 0x3f3180003f318000;
        auVar231._8_4_ = 0x3f800000;
        auVar231._0_8_ = 0x3f8000003f800000;
        auVar220._8_4_ = 0x3d2aa9c1;
        auVar220._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar198._8_4_ = 0x3f000000;
        auVar198._0_8_ = 0x3f0000003f000000;
        auVar183._8_4_ = 0x3c088908;
        auVar183._0_8_ = 0x3c0889083c088908;
        auVar165._8_4_ = 0x39506967;
        auVar165._0_8_ = 0x3950696739506967;
        auVar141._8_4_ = 0x3fb8aa3b;
        auVar141._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar128._8_4_ = 0xc2b0c0a5;
        auVar128._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar111._8_4_ = 0x42b0c0a5;
        auVar111._0_8_ = 0x42b0c0a542b0c0a5;
        auVar321._12_4_ = 0x3e2aaaaa;
        auVar284._12_4_ = 0x395e8083;
        auVar252._12_4_ = 0x3f318000;
        auVar231._12_4_ = 0x3f800000;
        auVar220._12_4_ = 0x3d2aa9c1;
        auVar198._12_4_ = 0x3f000000;
        auVar183._12_4_ = 0x3c088908;
        auVar165._12_4_ = 0x39506967;
        auVar141._12_4_ = 0x3fb8aa3b;
        auVar128._12_4_ = 0xc2b0c0a5;
        auVar111._12_4_ = 0x42b0c0a5;
        auVar321._16_4_ = 0x3e2aaaaa;
        auVar284._16_4_ = 0x395e8083;
        auVar252._16_4_ = 0x3f318000;
        auVar231._16_4_ = 0x3f800000;
        auVar220._16_4_ = 0x3d2aa9c1;
        auVar198._16_4_ = 0x3f000000;
        auVar183._16_4_ = 0x3c088908;
        auVar165._16_4_ = 0x39506967;
        auVar141._16_4_ = 0x3fb8aa3b;
        auVar128._16_4_ = 0xc2b0c0a5;
        auVar111._16_4_ = 0x42b0c0a5;
        auVar321._20_4_ = 0x3e2aaaaa;
        auVar284._20_4_ = 0x395e8083;
        auVar252._20_4_ = 0x3f318000;
        auVar231._20_4_ = 0x3f800000;
        auVar220._20_4_ = 0x3d2aa9c1;
        auVar198._20_4_ = 0x3f000000;
        auVar183._20_4_ = 0x3c088908;
        auVar165._20_4_ = 0x39506967;
        auVar141._20_4_ = 0x3fb8aa3b;
        auVar128._20_4_ = 0xc2b0c0a5;
        auVar111._20_4_ = 0x42b0c0a5;
        auVar321._24_4_ = 0x3e2aaaaa;
        auVar284._24_4_ = 0x395e8083;
        auVar252._24_4_ = 0x3f318000;
        auVar231._24_4_ = 0x3f800000;
        auVar220._24_4_ = 0x3d2aa9c1;
        auVar198._24_4_ = 0x3f000000;
        auVar183._24_4_ = 0x3c088908;
        auVar165._24_4_ = 0x39506967;
        auVar141._24_4_ = 0x3fb8aa3b;
        auVar128._24_4_ = 0xc2b0c0a5;
        auVar111._24_4_ = 0x42b0c0a5;
        auVar321._28_4_ = 0x3e2aaaaa;
        auVar284._28_4_ = 0x395e8083;
        auVar252._28_4_ = 0x3f318000;
        auVar231._28_4_ = 0x3f800000;
        auVar220._28_4_ = 0x3d2aa9c1;
        auVar198._28_4_ = 0x3f000000;
        auVar183._28_4_ = 0x3c088908;
        auVar165._28_4_ = 0x39506967;
        auVar141._28_4_ = 0x3fb8aa3b;
        auVar128._28_4_ = 0xc2b0c0a5;
        auVar111._28_4_ = 0x42b0c0a5;
        pauVar16 = (undefined1 (*) [32])
                   (local_108->cstep * lVar15 * local_108->elemsize + (long)local_108->data);
        if (iVar7 < 8) {
          uVar18 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar37 = vminps_avx(auVar111,*pauVar16);
            auVar46 = vmaxps_avx(auVar37,auVar128);
            auVar20 = vfmadd213ps_fma(auVar141,auVar46,auVar198);
            auVar127 = vroundps_avx(ZEXT1632(auVar20),1);
            auVar37 = vcmpps_avx(ZEXT1632(auVar20),auVar127,1);
            auVar37 = vandps_avx(auVar231,auVar37);
            auVar37 = vsubps_avx(auVar127,auVar37);
            auVar20 = vfmsub231ps_fma(auVar46,auVar37,auVar252);
            auVar97 = vfmsub231ps_fma(ZEXT1632(auVar20),auVar37,auVar284);
            auVar46 = ZEXT1632(auVar97);
            auVar4._28_4_ = auVar127._28_4_;
            auVar4._0_28_ =
                 ZEXT1628(CONCAT412(auVar97._12_4_ * auVar97._12_4_,
                                    CONCAT48(auVar97._8_4_ * auVar97._8_4_,
                                             CONCAT44(auVar97._4_4_ * auVar97._4_4_,
                                                      auVar97._0_4_ * auVar97._0_4_))));
            auVar166._8_4_ = 0x3ab743ce;
            auVar166._0_8_ = 0x3ab743ce3ab743ce;
            auVar166._12_4_ = 0x3ab743ce;
            auVar166._16_4_ = 0x3ab743ce;
            auVar166._20_4_ = 0x3ab743ce;
            auVar166._24_4_ = 0x3ab743ce;
            auVar166._28_4_ = 0x3ab743ce;
            auVar20 = vfmadd213ps_fma(auVar165,auVar46,auVar166);
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar46,auVar183);
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar46,auVar220);
            auVar46 = ZEXT1632(auVar97);
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar46,auVar321);
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar46,auVar198);
            auVar108 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar4,auVar46);
            auVar27._0_4_ = (int)auVar37._0_4_;
            auVar27._4_4_ = (int)auVar37._4_4_;
            auVar27._8_4_ = (int)auVar37._8_4_;
            auVar27._12_4_ = (int)auVar37._12_4_;
            auVar47._16_4_ = (int)auVar37._16_4_;
            auVar47._0_16_ = auVar27;
            auVar47._20_4_ = (int)auVar37._20_4_;
            auVar47._24_4_ = (int)auVar37._24_4_;
            auVar47._28_4_ = (int)auVar37._28_4_;
            auVar97 = vpslld_avx(auVar27,0x17);
            auVar20 = vpslld_avx(auVar47._16_16_,0x17);
            auVar152._8_4_ = 0x3f800000;
            auVar152._0_8_ = 0x3f8000003f800000;
            auVar152._12_4_ = 0x3f800000;
            auVar20 = vpaddd_avx(auVar20,auVar152);
            auVar97 = vpaddd_avx(auVar97,auVar152);
            auVar48._16_16_ = auVar20;
            auVar48._0_16_ = auVar97;
            auVar20 = vfmadd213ps_fma(auVar48,ZEXT1632(auVar108),auVar48);
            *pauVar16 = ZEXT1632(auVar20);
            pauVar16 = pauVar16 + 1;
            iVar13 = iVar13 + 8;
          } while (iVar13 < iVar7);
          uVar18 = (uint)local_110;
        }
        auVar153._8_4_ = 0x3f800000;
        auVar153._0_8_ = 0x3f8000003f800000;
        auVar153._12_4_ = 0x3f800000;
        auVar177._8_4_ = 0x42b0c0a5;
        auVar177._0_8_ = 0x42b0c0a542b0c0a5;
        auVar177._12_4_ = 0x42b0c0a5;
        auVar189._8_4_ = 0xc2b0c0a5;
        auVar189._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar189._12_4_ = 0xc2b0c0a5;
        auVar210._8_4_ = 0x3fb8aa3b;
        auVar210._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar210._12_4_ = 0x3fb8aa3b;
        auVar226._8_4_ = 0x3f000000;
        auVar226._0_8_ = 0x3f0000003f000000;
        auVar226._12_4_ = 0x3f000000;
        auVar242._8_4_ = 0x3f318000;
        auVar242._0_8_ = 0x3f3180003f318000;
        auVar242._12_4_ = 0x3f318000;
        auVar263._8_4_ = 0x395e8083;
        auVar263._0_8_ = 0x395e8083395e8083;
        auVar263._12_4_ = 0x395e8083;
        auVar277._8_4_ = 0x3ab743ce;
        auVar277._0_8_ = 0x3ab743ce3ab743ce;
        auVar277._12_4_ = 0x3ab743ce;
        auVar289._8_4_ = 0x39506967;
        auVar289._0_8_ = 0x3950696739506967;
        auVar289._12_4_ = 0x39506967;
        auVar297._8_4_ = 0x3c088908;
        auVar297._0_8_ = 0x3c0889083c088908;
        auVar297._12_4_ = 0x3c088908;
        auVar307._8_4_ = 0x3d2aa9c1;
        auVar307._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar307._12_4_ = 0x3d2aa9c1;
        auVar314._8_4_ = 0x3e2aaaaa;
        auVar314._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar314._12_4_ = 0x3e2aaaaa;
        uVar8 = uVar18 | 3;
        while ((int)uVar8 < iVar7) {
          auVar20 = vminps_avx(auVar177,*(undefined1 (*) [16])*pauVar16);
          auVar108 = vmaxps_avx(auVar20,auVar189);
          auVar20 = vfmadd213ps_fma(auVar210,auVar108,auVar226);
          auVar119._0_4_ = (int)auVar20._0_4_;
          auVar119._4_4_ = (int)auVar20._4_4_;
          auVar119._8_4_ = (int)auVar20._8_4_;
          auVar119._12_4_ = (int)auVar20._12_4_;
          auVar97 = vcvtdq2ps_avx(auVar119);
          auVar20 = vcmpps_avx(auVar20,auVar97,1);
          auVar20 = vandps_avx(auVar20,auVar153);
          auVar20 = vsubps_avx(auVar97,auVar20);
          auVar97 = vfmsub231ps_fma(auVar108,auVar20,auVar242);
          auVar108 = vfmsub231ps_fma(auVar97,auVar20,auVar263);
          auVar120._0_4_ = auVar108._0_4_ * auVar108._0_4_;
          auVar120._4_4_ = auVar108._4_4_ * auVar108._4_4_;
          auVar120._8_4_ = auVar108._8_4_ * auVar108._8_4_;
          auVar120._12_4_ = auVar108._12_4_ * auVar108._12_4_;
          auVar97 = vfmadd213ps_fma(auVar289,auVar108,auVar277);
          auVar97 = vfmadd213ps_fma(auVar97,auVar108,auVar297);
          auVar97 = vfmadd213ps_fma(auVar97,auVar108,auVar307);
          auVar97 = vfmadd213ps_fma(auVar97,auVar108,auVar314);
          auVar97 = vfmadd213ps_fma(auVar97,auVar108,auVar226);
          auVar97 = vfmadd213ps_fma(auVar97,auVar120,auVar108);
          auVar28._0_4_ = (int)auVar20._0_4_;
          auVar28._4_4_ = (int)auVar20._4_4_;
          auVar28._8_4_ = (int)auVar20._8_4_;
          auVar28._12_4_ = (int)auVar20._12_4_;
          auVar20 = vpslld_avx(auVar28,0x17);
          auVar20 = vpaddd_avx(auVar20,auVar153);
          auVar20 = vfmadd213ps_fma(auVar20,auVar97,auVar20);
          *(undefined1 (*) [16])*pauVar16 = auVar20;
          pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
          uVar8 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        auVar20 = vpcmpeqd_avx(auVar177,auVar177);
        if ((int)uVar18 < iVar7) {
          uVar9 = CONCAT44(0,~uVar18 + iVar7);
          auVar29._8_8_ = 0;
          auVar29._0_8_ = uVar9;
          local_a0._0_16_ = vpshufd_avx(auVar29,0x44);
          local_d0 = vorps_avx(local_a0._0_16_,local_120);
          local_e0 = vorps_avx(local_a0._0_16_,local_120);
          uVar14 = 0;
          auVar37 = _DAT_0054ed20;
          local_a0._16_16_ = local_a0._0_16_;
          do {
            auVar30._8_8_ = 0;
            auVar30._0_8_ = uVar14;
            auVar97 = vpshufd_avx(auVar30,0x44);
            auVar49._16_16_ = auVar97;
            auVar49._0_16_ = auVar97;
            auVar46 = vorps_avx(auVar49,_DAT_0054ed00);
            auVar37 = vorps_avx(auVar49,auVar37);
            auVar174 = vpor_avx(local_a0._16_16_,local_120);
            auVar97 = vpcmpgtq_avx(auVar37._16_16_ ^ local_120,auVar174);
            auVar108 = vpcmpgtq_avx(auVar37._0_16_ ^ local_120,local_d0);
            auVar97 = vpackssdw_avx(auVar108,auVar97);
            auVar108 = vpcmpgtq_avx(auVar46._16_16_ ^ local_120,auVar174);
            auVar106._0_4_ = auVar46._0_4_ ^ local_120._0_4_;
            auVar106._4_4_ = auVar46._4_4_ ^ local_120._4_4_;
            auVar106._8_4_ = auVar46._8_4_ ^ local_120._8_4_;
            auVar106._12_4_ = auVar46._12_4_ ^ local_120._12_4_;
            auVar174 = vpcmpgtq_avx(auVar106,local_e0);
            auVar108 = vpackssdw_avx(auVar174,auVar108);
            auVar97 = vpackssdw_avx(auVar108 ^ auVar20,auVar97 ^ auVar20);
            auVar108 = vpmovsxwd_avx(auVar97);
            auVar97 = vpunpckhwd_avx(auVar97,auVar97);
            local_c0._16_16_ = auVar97;
            local_c0._0_16_ = auVar108;
            local_100 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(*pauVar16 + uVar14 * 4));
            _local_140 = local_100._16_16_;
            local_150._0_4_ = expf(local_100._16_4_);
            local_150._4_4_ = extraout_XMM0_Db_23;
            local_150._8_4_ = extraout_XMM0_Dc_23;
            local_150._12_4_ = extraout_XMM0_Dd_23;
            auVar97 = vmovshdup_avx(_local_140);
            auVar75._0_4_ = expf(auVar97._0_4_);
            auVar75._4_60_ = extraout_var_15;
            local_150 = vinsertps_avx(local_150,auVar75._0_16_,0x10);
            auVar97 = vpermilpd_avx(_local_140,1);
            auVar76._0_4_ = expf(auVar97._0_4_);
            auVar76._4_60_ = extraout_var_16;
            local_150 = vinsertps_avx(local_150,auVar76._0_16_,0x20);
            auVar97 = vpermilps_avx(_local_140,0xff);
            auVar77._0_4_ = expf(auVar97._0_4_);
            auVar77._4_60_ = extraout_var_17;
            _local_140 = vinsertps_avx(local_150,auVar77._0_16_,0x30);
            local_150._0_4_ = expf((float)local_100._0_4_);
            local_150._4_4_ = extraout_XMM0_Db_24;
            local_150._8_4_ = extraout_XMM0_Dc_24;
            local_150._12_4_ = extraout_XMM0_Dd_24;
            auVar97 = vmovshdup_avx(local_100._0_16_);
            auVar78._0_4_ = expf(auVar97._0_4_);
            auVar78._4_60_ = extraout_var_18;
            local_150 = vinsertps_avx(local_150,auVar78._0_16_,0x10);
            auVar97 = vpermilpd_avx(local_100._0_16_,1);
            auVar79._0_4_ = expf(auVar97._0_4_);
            auVar79._4_60_ = extraout_var_19;
            local_150 = vinsertps_avx(local_150,auVar79._0_16_,0x20);
            auVar97 = vpermilps_avx(local_100._0_16_,0xff);
            auVar80._0_4_ = expf(auVar97._0_4_);
            auVar37 = _DAT_0054ed20;
            auVar80._4_60_ = extraout_var_20;
            auVar20 = vpcmpeqd_avx(auVar20,auVar20);
            auVar97 = vinsertps_avx(local_150,auVar80._0_16_,0x30);
            auVar50._16_16_ = _local_140;
            auVar50._0_16_ = auVar97;
            auVar46 = vmaskmovps_avx(local_c0,auVar50);
            *(undefined1 (*) [32])(*pauVar16 + uVar14 * 4) = auVar46;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != local_128);
    }
    break;
  case 8:
    local_128 = (ulong)bottom_top_blob->c;
    if (0 < (long)local_128) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_110 = CONCAT44(local_110._4_4_,iVar7) & 0xfffffffffffffff8;
      lVar15 = 0;
      local_120._8_8_ = 0x8000000000000000;
      local_120._0_8_ = 0x8000000000000000;
      do {
        auVar323._8_4_ = 0x3e11e9bf;
        auVar323._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar310._8_4_ = 0xbdfe5d4f;
        auVar310._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar304._8_4_ = 0x3def251a;
        auVar304._0_8_ = 0x3def251a3def251a;
        auVar294._8_4_ = 0x3d9021bb;
        auVar294._0_8_ = 0x3d9021bb3d9021bb;
        auVar285._8_4_ = 0xbdebd1b8;
        auVar285._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar257._8_4_ = 0x3f3504f3;
        auVar257._0_8_ = 0x3f3504f33f3504f3;
        auVar221._8_4_ = 0x3f000000;
        auVar221._0_8_ = 0x3f0000003f000000;
        auVar200._8_4_ = 0x807fffff;
        auVar200._0_8_ = 0x807fffff807fffff;
        auVar184._8_4_ = 0x800000;
        auVar184._0_8_ = 0x80000000800000;
        auVar323._12_4_ = 0x3e11e9bf;
        auVar310._12_4_ = 0xbdfe5d4f;
        auVar304._12_4_ = 0x3def251a;
        auVar294._12_4_ = 0x3d9021bb;
        auVar285._12_4_ = 0xbdebd1b8;
        auVar257._12_4_ = 0x3f3504f3;
        auVar221._12_4_ = 0x3f000000;
        auVar200._12_4_ = 0x807fffff;
        auVar184._12_4_ = 0x800000;
        auVar323._16_4_ = 0x3e11e9bf;
        auVar310._16_4_ = 0xbdfe5d4f;
        auVar304._16_4_ = 0x3def251a;
        auVar294._16_4_ = 0x3d9021bb;
        auVar285._16_4_ = 0xbdebd1b8;
        auVar257._16_4_ = 0x3f3504f3;
        auVar221._16_4_ = 0x3f000000;
        auVar200._16_4_ = 0x807fffff;
        auVar184._16_4_ = 0x800000;
        auVar323._20_4_ = 0x3e11e9bf;
        auVar310._20_4_ = 0xbdfe5d4f;
        auVar304._20_4_ = 0x3def251a;
        auVar294._20_4_ = 0x3d9021bb;
        auVar285._20_4_ = 0xbdebd1b8;
        auVar257._20_4_ = 0x3f3504f3;
        auVar221._20_4_ = 0x3f000000;
        auVar200._20_4_ = 0x807fffff;
        auVar184._20_4_ = 0x800000;
        auVar228._8_4_ = 0xffffff81;
        auVar228._0_8_ = 0xffffff81ffffff81;
        auVar323._24_4_ = 0x3e11e9bf;
        auVar310._24_4_ = 0xbdfe5d4f;
        auVar304._24_4_ = 0x3def251a;
        auVar294._24_4_ = 0x3d9021bb;
        auVar285._24_4_ = 0xbdebd1b8;
        auVar257._24_4_ = 0x3f3504f3;
        auVar221._24_4_ = 0x3f000000;
        auVar200._24_4_ = 0x807fffff;
        auVar184._24_4_ = 0x800000;
        auVar323._28_4_ = 0x3e11e9bf;
        auVar310._28_4_ = 0xbdfe5d4f;
        auVar304._28_4_ = 0x3def251a;
        auVar294._28_4_ = 0x3d9021bb;
        auVar285._28_4_ = 0xbdebd1b8;
        auVar257._28_4_ = 0x3f3504f3;
        auVar228._12_4_ = 0xffffff81;
        auVar221._28_4_ = 0x3f000000;
        auVar200._28_4_ = 0x807fffff;
        auVar184._28_4_ = 0x800000;
        pauVar16 = (undefined1 (*) [32])
                   (local_108->cstep * lVar15 * local_108->elemsize + (long)local_108->data);
        if (iVar7 < 8) {
          uVar18 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar37 = vmaxps_avx(auVar184,*pauVar16);
            auVar97 = vpsrld_avx(auVar37._0_16_,0x17);
            auVar20 = vpsrld_avx(auVar37._16_16_,0x17);
            auVar37 = vandps_avx(auVar37,auVar200);
            auVar127 = vorps_avx(auVar37,auVar221);
            auVar46 = vcmpps_avx(auVar257,auVar127,2);
            auVar37 = vandnps_avx(auVar46,auVar127);
            auVar54._0_4_ = auVar127._0_4_ + -1.0 + auVar37._0_4_;
            auVar54._4_4_ = auVar127._4_4_ + -1.0 + auVar37._4_4_;
            auVar54._8_4_ = auVar127._8_4_ + -1.0 + auVar37._8_4_;
            auVar54._12_4_ = auVar127._12_4_ + -1.0 + auVar37._12_4_;
            auVar54._16_4_ = auVar127._16_4_ + -1.0 + auVar37._16_4_;
            auVar54._20_4_ = auVar127._20_4_ + -1.0 + auVar37._20_4_;
            auVar54._24_4_ = auVar127._24_4_ + -1.0 + auVar37._24_4_;
            auVar54._28_4_ = auVar127._28_4_ + -1.0 + auVar37._28_4_;
            auVar20 = vpsubd_avx(auVar20,auVar46._16_16_);
            auVar20 = vpaddd_avx(auVar228,auVar20);
            auVar97 = vpsubd_avx(auVar97,auVar46._0_16_);
            auVar97 = vpaddd_avx(auVar228,auVar97);
            auVar112._16_16_ = auVar20;
            auVar112._0_16_ = auVar97;
            auVar130._0_4_ = auVar54._0_4_ * auVar54._0_4_;
            auVar130._4_4_ = auVar54._4_4_ * auVar54._4_4_;
            auVar130._8_4_ = auVar54._8_4_ * auVar54._8_4_;
            auVar130._12_4_ = auVar54._12_4_ * auVar54._12_4_;
            auVar130._16_4_ = auVar54._16_4_ * auVar54._16_4_;
            auVar130._20_4_ = auVar54._20_4_ * auVar54._20_4_;
            auVar130._24_4_ = auVar54._24_4_ * auVar54._24_4_;
            auVar130._28_4_ = 0;
            auVar20 = vfmadd213ps_fma(auVar294,auVar54,auVar285);
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar54,auVar304);
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar54,auVar310);
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar54,auVar323);
            auVar169._8_4_ = 0xbe2aae50;
            auVar169._0_8_ = 0xbe2aae50be2aae50;
            auVar169._12_4_ = 0xbe2aae50;
            auVar169._16_4_ = 0xbe2aae50;
            auVar169._20_4_ = 0xbe2aae50;
            auVar169._24_4_ = 0xbe2aae50;
            auVar169._28_4_ = 0xbe2aae50;
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar54,auVar169);
            auVar170._8_4_ = 0x3e4cceac;
            auVar170._0_8_ = 0x3e4cceac3e4cceac;
            auVar170._12_4_ = 0x3e4cceac;
            auVar170._16_4_ = 0x3e4cceac;
            auVar170._20_4_ = 0x3e4cceac;
            auVar170._24_4_ = 0x3e4cceac;
            auVar170._28_4_ = 0x3e4cceac;
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar54,auVar170);
            auVar171._8_4_ = 0xbe7ffffc;
            auVar171._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar171._12_4_ = 0xbe7ffffc;
            auVar171._16_4_ = 0xbe7ffffc;
            auVar171._20_4_ = 0xbe7ffffc;
            auVar171._24_4_ = 0xbe7ffffc;
            auVar171._28_4_ = 0xbe7ffffc;
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar54,auVar171);
            auVar172._8_4_ = 0x3eaaaaaa;
            auVar172._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar172._12_4_ = 0x3eaaaaaa;
            auVar172._16_4_ = 0x3eaaaaaa;
            auVar172._20_4_ = 0x3eaaaaaa;
            auVar172._24_4_ = 0x3eaaaaaa;
            auVar172._28_4_ = 0x3eaaaaaa;
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar54,auVar172);
            auVar143._0_4_ = auVar130._0_4_ * auVar54._0_4_ * auVar20._0_4_;
            auVar143._4_4_ = auVar130._4_4_ * auVar54._4_4_ * auVar20._4_4_;
            auVar143._8_4_ = auVar130._8_4_ * auVar54._8_4_ * auVar20._8_4_;
            auVar143._12_4_ = auVar130._12_4_ * auVar54._12_4_ * auVar20._12_4_;
            auVar143._16_4_ = auVar130._16_4_ * auVar54._16_4_ * 0.0;
            auVar143._20_4_ = auVar130._20_4_ * auVar54._20_4_ * 0.0;
            auVar143._24_4_ = auVar130._24_4_ * auVar54._24_4_ * 0.0;
            auVar143._28_4_ = 0;
            auVar37 = vcvtdq2ps_avx(auVar112);
            auVar173._8_4_ = 0xb95e8083;
            auVar173._0_8_ = 0xb95e8083b95e8083;
            auVar173._12_4_ = 0xb95e8083;
            auVar173._16_4_ = 0xb95e8083;
            auVar173._20_4_ = 0xb95e8083;
            auVar173._24_4_ = 0xb95e8083;
            auVar173._28_4_ = 0xb95e8083;
            auVar20 = vfmadd231ps_fma(auVar143,auVar37,auVar173);
            auVar20 = vfmsub231ps_fma(ZEXT1632(auVar20),auVar221,auVar130);
            auVar46 = vsubps_avx(ZEXT1632(auVar20),auVar54);
            auVar131._8_4_ = 0x3f318000;
            auVar131._0_8_ = 0x3f3180003f318000;
            auVar131._12_4_ = 0x3f318000;
            auVar131._16_4_ = 0x3f318000;
            auVar131._20_4_ = 0x3f318000;
            auVar131._24_4_ = 0x3f318000;
            auVar131._28_4_ = 0x3f318000;
            auVar20 = vfmsub231ps_fma(auVar46,auVar131,auVar37);
            *pauVar16 = ZEXT1632(auVar20);
            pauVar16 = pauVar16 + 1;
            iVar13 = iVar13 + 8;
          } while (iVar13 < iVar7);
          uVar18 = (uint)local_110;
        }
        auVar181._8_4_ = 0x800000;
        auVar181._0_8_ = 0x80000000800000;
        auVar181._12_4_ = 0x800000;
        auVar212._8_4_ = 0x3f000000;
        auVar212._0_8_ = 0x3f0000003f000000;
        auVar212._12_4_ = 0x3f000000;
        auVar229._8_4_ = 0xffffff82;
        auVar229._0_8_ = 0xffffff82ffffff82;
        auVar229._12_4_ = 0xffffff82;
        auVar248._8_4_ = 0x3f3504f3;
        auVar248._0_8_ = 0x3f3504f33f3504f3;
        auVar248._12_4_ = 0x3f3504f3;
        auVar283._8_4_ = 0x3f800000;
        auVar283._0_8_ = 0x3f8000003f800000;
        auVar283._12_4_ = 0x3f800000;
        auVar292._8_4_ = 0xbdebd1b8;
        auVar292._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar292._12_4_ = 0xbdebd1b8;
        auVar300._8_4_ = 0x3d9021bb;
        auVar300._0_8_ = 0x3d9021bb3d9021bb;
        auVar300._12_4_ = 0x3d9021bb;
        auVar309._8_4_ = 0x3def251a;
        auVar309._0_8_ = 0x3def251a3def251a;
        auVar309._12_4_ = 0x3def251a;
        auVar320._8_4_ = 0xbdfe5d4f;
        auVar320._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar320._12_4_ = 0xbdfe5d4f;
        auVar195._8_4_ = 0x3e11e9bf;
        auVar195._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar195._12_4_ = 0x3e11e9bf;
        uVar8 = uVar18 | 3;
        while ((int)uVar8 < iVar7) {
          auVar20 = vmaxps_avx(auVar181,*(undefined1 (*) [16])*pauVar16);
          auVar97 = vpsrld_avx(auVar20,0x17);
          auVar97 = vpaddd_avx(auVar229,auVar97);
          auVar124._8_4_ = 0x807fffff;
          auVar124._0_8_ = 0x807fffff807fffff;
          auVar124._12_4_ = 0x807fffff;
          auVar20 = vandps_avx(auVar20,auVar124);
          auVar174 = vorps_avx(auVar20,auVar212);
          auVar108 = vcvtdq2ps_avx(auVar97);
          auVar97 = vcmpps_avx(auVar174,auVar248,1);
          auVar20 = vandps_avx(auVar97,auVar174);
          auVar34._0_4_ = auVar174._0_4_ + -1.0 + auVar20._0_4_;
          auVar34._4_4_ = auVar174._4_4_ + -1.0 + auVar20._4_4_;
          auVar34._8_4_ = auVar174._8_4_ + -1.0 + auVar20._8_4_;
          auVar34._12_4_ = auVar174._12_4_ + -1.0 + auVar20._12_4_;
          auVar20 = vandps_avx(auVar283,auVar97);
          auVar20 = vsubps_avx(auVar108,auVar20);
          auVar125._0_4_ = auVar34._0_4_ * auVar34._0_4_;
          auVar125._4_4_ = auVar34._4_4_ * auVar34._4_4_;
          auVar125._8_4_ = auVar34._8_4_ * auVar34._8_4_;
          auVar125._12_4_ = auVar34._12_4_ * auVar34._12_4_;
          auVar97 = vfmadd213ps_fma(auVar300,auVar34,auVar292);
          auVar97 = vfmadd213ps_fma(auVar97,auVar34,auVar309);
          auVar97 = vfmadd213ps_fma(auVar97,auVar34,auVar320);
          auVar97 = vfmadd213ps_fma(auVar97,auVar34,auVar195);
          auVar159._8_4_ = 0xbe2aae50;
          auVar159._0_8_ = 0xbe2aae50be2aae50;
          auVar159._12_4_ = 0xbe2aae50;
          auVar97 = vfmadd213ps_fma(auVar97,auVar34,auVar159);
          auVar160._8_4_ = 0x3e4cceac;
          auVar160._0_8_ = 0x3e4cceac3e4cceac;
          auVar160._12_4_ = 0x3e4cceac;
          auVar97 = vfmadd213ps_fma(auVar97,auVar34,auVar160);
          auVar161._8_4_ = 0xbe7ffffc;
          auVar161._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar161._12_4_ = 0xbe7ffffc;
          auVar97 = vfmadd213ps_fma(auVar97,auVar34,auVar161);
          auVar162._8_4_ = 0x3eaaaaaa;
          auVar162._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar162._12_4_ = 0x3eaaaaaa;
          auVar97 = vfmadd213ps_fma(auVar97,auVar34,auVar162);
          auVar139._0_4_ = auVar125._0_4_ * auVar34._0_4_ * auVar97._0_4_;
          auVar139._4_4_ = auVar125._4_4_ * auVar34._4_4_ * auVar97._4_4_;
          auVar139._8_4_ = auVar125._8_4_ * auVar34._8_4_ * auVar97._8_4_;
          auVar139._12_4_ = auVar125._12_4_ * auVar34._12_4_ * auVar97._12_4_;
          auVar163._8_4_ = 0xb95e8083;
          auVar163._0_8_ = 0xb95e8083b95e8083;
          auVar163._12_4_ = 0xb95e8083;
          auVar97 = vfmadd231ps_fma(auVar139,auVar20,auVar163);
          auVar97 = vfmsub231ps_fma(auVar97,auVar212,auVar125);
          auVar97 = vsubps_avx(auVar97,auVar34);
          auVar126._8_4_ = 0x3f318000;
          auVar126._0_8_ = 0x3f3180003f318000;
          auVar126._12_4_ = 0x3f318000;
          auVar20 = vfmsub231ps_fma(auVar97,auVar126,auVar20);
          *(undefined1 (*) [16])*pauVar16 = auVar20;
          pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
          uVar8 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        auVar20 = vpcmpeqd_avx(auVar181,auVar181);
        if ((int)uVar18 < iVar7) {
          uVar9 = CONCAT44(0,~uVar18 + iVar7);
          auVar35._8_8_ = 0;
          auVar35._0_8_ = uVar9;
          local_a0._0_16_ = vpshufd_avx(auVar35,0x44);
          local_d0 = vpor_avx(local_a0._0_16_,local_120);
          local_e0 = vpor_avx(local_a0._0_16_,local_120);
          uVar14 = 0;
          auVar37 = _DAT_0054ed20;
          local_a0._16_16_ = local_a0._0_16_;
          do {
            auVar36._8_8_ = 0;
            auVar36._0_8_ = uVar14;
            auVar97 = vpshufd_avx(auVar36,0x44);
            auVar55._16_16_ = auVar97;
            auVar55._0_16_ = auVar97;
            auVar46 = vorps_avx(auVar55,_DAT_0054ed00);
            auVar37 = vorps_avx(auVar55,auVar37);
            auVar174 = vpor_avx(local_a0._16_16_,local_120);
            auVar97 = vpcmpgtq_avx(auVar37._16_16_ ^ local_120,auVar174);
            auVar108 = vpcmpgtq_avx(auVar37._0_16_ ^ local_120,local_d0);
            auVar97 = vpackssdw_avx(auVar108,auVar97);
            auVar108 = vpcmpgtq_avx(auVar46._16_16_ ^ local_120,auVar174);
            auVar110._0_4_ = auVar46._0_4_ ^ local_120._0_4_;
            auVar110._4_4_ = auVar46._4_4_ ^ local_120._4_4_;
            auVar110._8_4_ = auVar46._8_4_ ^ local_120._8_4_;
            auVar110._12_4_ = auVar46._12_4_ ^ local_120._12_4_;
            auVar174 = vpcmpgtq_avx(auVar110,local_e0);
            auVar108 = vpackssdw_avx(auVar174,auVar108);
            auVar97 = vpackssdw_avx(auVar108 ^ auVar20,auVar97 ^ auVar20);
            auVar108 = vpmovsxwd_avx(auVar97);
            auVar97 = vpunpckhwd_avx(auVar97,auVar97);
            local_c0._16_16_ = auVar97;
            local_c0._0_16_ = auVar108;
            local_100 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(*pauVar16 + uVar14 * 4));
            _local_140 = local_100._16_16_;
            local_150._0_4_ = logf(local_100._16_4_);
            local_150._4_4_ = extraout_XMM0_Db_37;
            local_150._8_4_ = extraout_XMM0_Dc_37;
            local_150._12_4_ = extraout_XMM0_Dd_37;
            auVar97 = vmovshdup_avx(_local_140);
            auVar89._0_4_ = logf(auVar97._0_4_);
            auVar89._4_60_ = extraout_var_29;
            local_150 = vinsertps_avx(local_150,auVar89._0_16_,0x10);
            auVar97 = vpermilpd_avx(_local_140,1);
            auVar90._0_4_ = logf(auVar97._0_4_);
            auVar90._4_60_ = extraout_var_30;
            local_150 = vinsertps_avx(local_150,auVar90._0_16_,0x20);
            auVar97 = vpermilps_avx(_local_140,0xff);
            auVar91._0_4_ = logf(auVar97._0_4_);
            auVar91._4_60_ = extraout_var_31;
            _local_140 = vinsertps_avx(local_150,auVar91._0_16_,0x30);
            local_150._0_4_ = logf((float)local_100._0_4_);
            local_150._4_4_ = extraout_XMM0_Db_38;
            local_150._8_4_ = extraout_XMM0_Dc_38;
            local_150._12_4_ = extraout_XMM0_Dd_38;
            auVar97 = vmovshdup_avx(local_100._0_16_);
            auVar92._0_4_ = logf(auVar97._0_4_);
            auVar92._4_60_ = extraout_var_32;
            local_150 = vinsertps_avx(local_150,auVar92._0_16_,0x10);
            auVar97 = vpermilpd_avx(local_100._0_16_,1);
            auVar93._0_4_ = logf(auVar97._0_4_);
            auVar93._4_60_ = extraout_var_33;
            local_150 = vinsertps_avx(local_150,auVar93._0_16_,0x20);
            auVar97 = vpermilps_avx(local_100._0_16_,0xff);
            auVar94._0_4_ = logf(auVar97._0_4_);
            auVar37 = _DAT_0054ed20;
            auVar94._4_60_ = extraout_var_34;
            auVar20 = vpcmpeqd_avx(auVar20,auVar20);
            auVar97 = vinsertps_avx(local_150,auVar94._0_16_,0x30);
            auVar56._16_16_ = _local_140;
            auVar56._0_16_ = auVar97;
            auVar46 = vmaskmovps_avx(local_c0,auVar56);
            *(undefined1 (*) [32])(*pauVar16 + uVar14 * 4) = auVar46;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != local_128);
    }
    break;
  case 9:
    local_110 = (ulong)bottom_top_blob->c;
    if (0 < (long)local_110) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_128 = 0;
      local_120._8_8_ = 0x8000000000000000;
      local_120._0_8_ = 0x8000000000000000;
      do {
        auVar20 = in_ZMM8._0_16_;
        pfVar12 = (float *)(local_108->cstep * local_128 * local_108->elemsize +
                           (long)local_108->data);
        if (iVar7 < 8) {
          uVar18 = 0;
        }
        else {
          uVar8 = 0;
          do {
            local_80 = *(undefined1 (*) [32])pfVar12;
            UnaryOp_x86_fma_functor::unary_op_sin::func_pack8
                      ((unary_op_sin *)&local_151,(__m256 *)local_80);
            auVar20 = in_ZMM8._0_16_;
            *(undefined1 (*) [32])pfVar12 = local_80;
            pfVar12 = pfVar12 + 8;
            uVar18 = uVar8 + 8;
            iVar13 = uVar8 + 0xf;
            uVar8 = uVar18;
          } while (iVar13 < iVar7);
        }
        uVar8 = uVar18 | 3;
        auVar20 = vpcmpeqd_avx(auVar20,auVar20);
        in_ZMM8 = ZEXT1664(auVar20);
        auVar261._8_4_ = 2;
        auVar261._0_8_ = 0x200000002;
        auVar261._12_4_ = 2;
        auVar296._8_4_ = 0xbf490000;
        auVar296._0_8_ = 0xbf490000bf490000;
        auVar296._12_4_ = 0xbf490000;
        auVar306._8_4_ = 0xb97da000;
        auVar306._0_8_ = 0xb97da000b97da000;
        auVar306._12_4_ = 0xb97da000;
        auVar313._8_4_ = 0xb3222169;
        auVar313._0_8_ = 0xb3222169b3222169;
        auVar313._12_4_ = 0xb3222169;
        auVar205._8_4_ = 0x37ccf5ce;
        auVar205._0_8_ = 0x37ccf5ce37ccf5ce;
        auVar205._12_4_ = 0x37ccf5ce;
        auVar274._8_4_ = 0x3d2aaaa5;
        auVar274._0_8_ = 0x3d2aaaa53d2aaaa5;
        auVar274._12_4_ = 0x3d2aaaa5;
        auVar235._8_4_ = 0x3f000000;
        auVar235._0_8_ = 0x3f0000003f000000;
        auVar235._12_4_ = 0x3f000000;
        while ((int)uVar8 < iVar7) {
          auVar101._8_4_ = 0x7fffffff;
          auVar101._0_8_ = 0x7fffffff7fffffff;
          auVar101._12_4_ = 0x7fffffff;
          auVar97 = vandps_avx(*(undefined1 (*) [16])pfVar12,auVar101);
          auVar102._0_4_ = (int)(auVar97._0_4_ * 1.2732395);
          auVar102._4_4_ = (int)(auVar97._4_4_ * 1.2732395);
          auVar102._8_4_ = (int)(auVar97._8_4_ * 1.2732395);
          auVar102._12_4_ = (int)(auVar97._12_4_ * 1.2732395);
          auVar174 = vpsubd_avx(auVar102,auVar20);
          auVar133._8_4_ = 0xfffffffe;
          auVar133._0_8_ = 0xfffffffefffffffe;
          auVar133._12_4_ = 0xfffffffe;
          auVar108 = vpand_avx(auVar174,auVar133);
          auVar108 = vcvtdq2ps_avx(auVar108);
          auVar97 = vfmadd231ps_fma(auVar97,auVar108,auVar296);
          auVar97 = vfmadd231ps_fma(auVar97,auVar108,auVar306);
          auVar108 = vfmadd231ps_fma(auVar97,auVar313,auVar108);
          auVar134._0_4_ = auVar108._0_4_ * auVar108._0_4_;
          auVar134._4_4_ = auVar108._4_4_ * auVar108._4_4_;
          auVar134._8_4_ = auVar108._8_4_ * auVar108._8_4_;
          auVar134._12_4_ = auVar108._12_4_ * auVar108._12_4_;
          auVar175._8_4_ = 0xbab6061a;
          auVar175._0_8_ = 0xbab6061abab6061a;
          auVar175._12_4_ = 0xbab6061a;
          auVar97 = vfmadd213ps_fma(auVar205,auVar134,auVar175);
          auVar97 = vfmadd213ps_fma(auVar97,auVar134,auVar274);
          auVar147._0_4_ = auVar134._0_4_ * auVar134._0_4_ * auVar97._0_4_;
          auVar147._4_4_ = auVar134._4_4_ * auVar134._4_4_ * auVar97._4_4_;
          auVar147._8_4_ = auVar134._8_4_ * auVar134._8_4_ * auVar97._8_4_;
          auVar147._12_4_ = auVar134._12_4_ * auVar134._12_4_ * auVar97._12_4_;
          auVar222 = vfnmadd231ps_fma(auVar147,auVar134,auVar235);
          auVar176._8_4_ = 0xb94ca1f9;
          auVar176._0_8_ = 0xb94ca1f9b94ca1f9;
          auVar176._12_4_ = 0xb94ca1f9;
          auVar186._8_4_ = 0x3c08839e;
          auVar186._0_8_ = 0x3c08839e3c08839e;
          auVar186._12_4_ = 0x3c08839e;
          auVar97 = vfmadd213ps_fma(auVar176,auVar134,auVar186);
          auVar187._8_4_ = 0xbe2aaaa3;
          auVar187._0_8_ = 0xbe2aaaa3be2aaaa3;
          auVar187._12_4_ = 0xbe2aaaa3;
          auVar97 = vfmadd213ps_fma(auVar97,auVar134,auVar187);
          auVar135._0_4_ = auVar97._0_4_ * auVar134._0_4_;
          auVar135._4_4_ = auVar97._4_4_ * auVar134._4_4_;
          auVar135._8_4_ = auVar97._8_4_ * auVar134._8_4_;
          auVar135._12_4_ = auVar97._12_4_ * auVar134._12_4_;
          auVar108 = vfmadd213ps_fma(auVar135,auVar108,auVar108);
          auVar97 = vpand_avx(auVar261,auVar174);
          auVar97 = vpcmpeqd_avx(auVar97,_DAT_0054c060);
          auVar148._0_4_ = auVar222._0_4_ + 1.0;
          auVar148._4_4_ = auVar222._4_4_ + 1.0;
          auVar148._8_4_ = auVar222._8_4_ + 1.0;
          auVar148._12_4_ = auVar222._12_4_ + 1.0;
          auVar97 = vblendvps_avx(auVar148,auVar108,auVar97);
          auVar108 = vpslld_avx(auVar174,0x1d);
          auVar103._8_4_ = 0x80000000;
          auVar103._0_8_ = 0x8000000080000000;
          auVar103._12_4_ = 0x80000000;
          auVar108 = vpand_avx(auVar108 ^ *(undefined1 (*) [16])pfVar12,auVar103);
          *(undefined1 (*) [16])pfVar12 = auVar108 ^ auVar97;
          pfVar12 = pfVar12 + 4;
          uVar8 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if ((int)uVar18 < iVar7) {
          uVar9 = CONCAT44(0,~uVar18 + iVar7);
          auVar25._8_8_ = 0;
          auVar25._0_8_ = uVar9;
          auVar20 = vpshufd_avx(auVar25,0x44);
          local_a0._16_16_ = auVar20;
          local_a0._0_16_ = auVar20;
          local_d0 = vpor_avx(auVar20,local_120);
          local_e0 = vpor_avx(auVar20,local_120);
          uVar14 = 0;
          auVar37 = _DAT_0054ed20;
          do {
            auVar26._8_8_ = 0;
            auVar26._0_8_ = uVar14;
            auVar20 = vpshufd_avx(auVar26,0x44);
            auVar43._16_16_ = auVar20;
            auVar43._0_16_ = auVar20;
            auVar46 = vorps_avx(auVar43,_DAT_0054ed00);
            auVar37 = vorps_avx(auVar43,auVar37);
            auVar108 = vpor_avx(local_a0._16_16_,local_120);
            auVar20 = vpcmpgtq_avx(auVar37._16_16_ ^ local_120,auVar108);
            auVar97 = vpcmpgtq_avx(auVar37._0_16_ ^ local_120,local_d0);
            auVar20 = vpackssdw_avx(auVar97,auVar20);
            auVar174 = in_ZMM8._0_16_;
            auVar97 = vpcmpgtq_avx(auVar46._16_16_ ^ local_120,auVar108);
            auVar104._0_4_ = auVar46._0_4_ ^ local_120._0_4_;
            auVar104._4_4_ = auVar46._4_4_ ^ local_120._4_4_;
            auVar104._8_4_ = auVar46._8_4_ ^ local_120._8_4_;
            auVar104._12_4_ = auVar46._12_4_ ^ local_120._12_4_;
            auVar108 = vpcmpgtq_avx(auVar104,local_e0);
            auVar97 = vpackssdw_avx(auVar108,auVar97);
            auVar20 = vpackssdw_avx(auVar174 ^ auVar97,auVar174 ^ auVar20);
            auVar97 = vpmovsxwd_avx(auVar20);
            auVar20 = vpunpckhwd_avx(auVar20,auVar20);
            local_c0._16_16_ = auVar20;
            local_c0._0_16_ = auVar97;
            local_100 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(pfVar12 + uVar14));
            _local_140 = local_100._16_16_;
            local_150._0_4_ = sinf(local_100._16_4_);
            local_150._4_4_ = extraout_XMM0_Db_21;
            local_150._8_4_ = extraout_XMM0_Dc_21;
            local_150._12_4_ = extraout_XMM0_Dd_21;
            auVar20 = vmovshdup_avx(_local_140);
            auVar69._0_4_ = sinf(auVar20._0_4_);
            auVar69._4_60_ = extraout_var_09;
            local_150 = vinsertps_avx(local_150,auVar69._0_16_,0x10);
            auVar20 = vpermilpd_avx(_local_140,1);
            auVar70._0_4_ = sinf(auVar20._0_4_);
            auVar70._4_60_ = extraout_var_10;
            local_150 = vinsertps_avx(local_150,auVar70._0_16_,0x20);
            auVar20 = vpermilps_avx(_local_140,0xff);
            auVar71._0_4_ = sinf(auVar20._0_4_);
            auVar71._4_60_ = extraout_var_11;
            _local_140 = vinsertps_avx(local_150,auVar71._0_16_,0x30);
            local_150._0_4_ = sinf((float)local_100._0_4_);
            local_150._4_4_ = extraout_XMM0_Db_22;
            local_150._8_4_ = extraout_XMM0_Dc_22;
            local_150._12_4_ = extraout_XMM0_Dd_22;
            auVar20 = vmovshdup_avx(local_100._0_16_);
            auVar72._0_4_ = sinf(auVar20._0_4_);
            auVar72._4_60_ = extraout_var_12;
            local_150 = vinsertps_avx(local_150,auVar72._0_16_,0x10);
            auVar20 = vpermilpd_avx(local_100._0_16_,1);
            auVar73._0_4_ = sinf(auVar20._0_4_);
            auVar73._4_60_ = extraout_var_13;
            local_150 = vinsertps_avx(local_150,auVar73._0_16_,0x20);
            auVar20 = vpermilps_avx(local_100._0_16_,0xff);
            auVar74._0_4_ = sinf(auVar20._0_4_);
            auVar37 = _DAT_0054ed20;
            auVar74._4_60_ = extraout_var_14;
            auVar20 = vpcmpeqd_avx(auVar174,auVar174);
            in_ZMM8 = ZEXT1664(auVar20);
            auVar20 = vinsertps_avx(local_150,auVar74._0_16_,0x30);
            auVar44._16_16_ = _local_140;
            auVar44._0_16_ = auVar20;
            auVar46 = vmaskmovps_avx(local_c0,auVar44);
            *(undefined1 (*) [32])(pfVar12 + uVar14) = auVar46;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        local_128 = local_128 + 1;
      } while (local_128 != local_110);
    }
    break;
  case 10:
    local_110 = (ulong)bottom_top_blob->c;
    if (0 < (long)local_110) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_128 = 0;
      local_120._8_8_ = 0x8000000000000000;
      local_120._0_8_ = 0x8000000000000000;
      do {
        auVar20 = in_ZMM7._0_16_;
        pfVar12 = (float *)(local_108->cstep * local_128 * local_108->elemsize +
                           (long)local_108->data);
        if (iVar7 < 8) {
          uVar18 = 0;
        }
        else {
          uVar8 = 0;
          do {
            local_80 = *(undefined1 (*) [32])pfVar12;
            UnaryOp_x86_fma_functor::unary_op_cos::func_pack8
                      ((unary_op_cos *)&local_151,(__m256 *)local_80);
            auVar20 = in_ZMM7._0_16_;
            *(undefined1 (*) [32])pfVar12 = local_80;
            pfVar12 = pfVar12 + 8;
            uVar18 = uVar8 + 8;
            iVar13 = uVar8 + 0xf;
            uVar8 = uVar18;
          } while (iVar13 < iVar7);
        }
        uVar8 = uVar18 | 3;
        auVar20 = vpcmpeqd_avx(auVar20,auVar20);
        in_ZMM7 = ZEXT1664(auVar20);
        auVar227._8_4_ = 0xfffffffe;
        auVar227._0_8_ = 0xfffffffefffffffe;
        auVar227._12_4_ = 0xfffffffe;
        auVar247._8_4_ = 2;
        auVar247._0_8_ = 0x200000002;
        auVar247._12_4_ = 2;
        auVar291._8_4_ = 0xb97da000;
        auVar291._0_8_ = 0xb97da000b97da000;
        auVar291._12_4_ = 0xb97da000;
        auVar299._8_4_ = 0xb3222169;
        auVar299._0_8_ = 0xb3222169b3222169;
        auVar299._12_4_ = 0xb3222169;
        auVar308._8_4_ = 0xbab6061a;
        auVar308._0_8_ = 0xbab6061abab6061a;
        auVar308._12_4_ = 0xbab6061a;
        auVar319._8_4_ = 0x37ccf5ce;
        auVar319._0_8_ = 0x37ccf5ce37ccf5ce;
        auVar319._12_4_ = 0x37ccf5ce;
        auVar282._8_4_ = 0x3c08839e;
        auVar282._0_8_ = 0x3c08839e3c08839e;
        auVar282._12_4_ = 0x3c08839e;
        auVar180._8_4_ = 0x80000000;
        auVar180._0_8_ = 0x8000000080000000;
        auVar180._12_4_ = 0x80000000;
        while ((int)uVar8 < iVar7) {
          auVar31._8_4_ = 0x7fffffff;
          auVar31._0_8_ = 0x7fffffff7fffffff;
          auVar31._12_4_ = 0x7fffffff;
          auVar97 = vandps_avx(auVar31,*(undefined1 (*) [16])pfVar12);
          auVar107._0_4_ = (int)(auVar97._0_4_ * 1.2732395);
          auVar107._4_4_ = (int)(auVar97._4_4_ * 1.2732395);
          auVar107._8_4_ = (int)(auVar97._8_4_ * 1.2732395);
          auVar107._12_4_ = (int)(auVar97._12_4_ * 1.2732395);
          auVar108 = vpsubd_avx(auVar107,auVar20);
          auVar174 = vpand_avx(auVar227,auVar108);
          auVar108 = vcvtdq2ps_avx(auVar174);
          auVar136._8_4_ = 0xbf490000;
          auVar136._0_8_ = 0xbf490000bf490000;
          auVar136._12_4_ = 0xbf490000;
          auVar97 = vfmadd231ps_fma(auVar97,auVar108,auVar136);
          auVar97 = vfmadd231ps_fma(auVar97,auVar108,auVar291);
          auVar222 = vfmadd231ps_fma(auVar97,auVar299,auVar108);
          auVar122._0_4_ = auVar222._0_4_ * auVar222._0_4_;
          auVar122._4_4_ = auVar222._4_4_ * auVar222._4_4_;
          auVar122._8_4_ = auVar222._8_4_ * auVar222._8_4_;
          auVar122._12_4_ = auVar222._12_4_ * auVar222._12_4_;
          auVar97 = vfmadd213ps_fma(auVar319,auVar122,auVar308);
          auVar156._8_4_ = 0x3d2aaaa5;
          auVar156._0_8_ = 0x3d2aaaa53d2aaaa5;
          auVar156._12_4_ = 0x3d2aaaa5;
          auVar97 = vfmadd213ps_fma(auVar97,auVar122,auVar156);
          auVar137._0_4_ = auVar122._0_4_ * auVar122._0_4_ * auVar97._0_4_;
          auVar137._4_4_ = auVar122._4_4_ * auVar122._4_4_ * auVar97._4_4_;
          auVar137._8_4_ = auVar122._8_4_ * auVar122._8_4_ * auVar97._8_4_;
          auVar137._12_4_ = auVar122._12_4_ * auVar122._12_4_ * auVar97._12_4_;
          auVar157._8_4_ = 0x3f000000;
          auVar157._0_8_ = 0x3f0000003f000000;
          auVar157._12_4_ = 0x3f000000;
          auVar232 = vfnmadd231ps_fma(auVar137,auVar122,auVar157);
          auVar158._8_4_ = 0xb94ca1f9;
          auVar158._0_8_ = 0xb94ca1f9b94ca1f9;
          auVar158._12_4_ = 0xb94ca1f9;
          auVar97 = vfmadd213ps_fma(auVar158,auVar122,auVar282);
          auVar194._8_4_ = 0xbe2aaaa3;
          auVar194._0_8_ = 0xbe2aaaa3be2aaaa3;
          auVar194._12_4_ = 0xbe2aaaa3;
          auVar97 = vfmadd213ps_fma(auVar97,auVar122,auVar194);
          auVar123._0_4_ = auVar97._0_4_ * auVar122._0_4_;
          auVar123._4_4_ = auVar97._4_4_ * auVar122._4_4_;
          auVar123._8_4_ = auVar97._8_4_ * auVar122._8_4_;
          auVar123._12_4_ = auVar97._12_4_ * auVar122._12_4_;
          auVar108 = vpaddd_avx(auVar227,auVar174);
          auVar174 = vfmadd213ps_fma(auVar123,auVar222,auVar222);
          auVar97 = vpand_avx(auVar247,auVar108);
          auVar97 = vpcmpeqd_avx(auVar97,_DAT_0054c060);
          auVar138._0_4_ = auVar232._0_4_ + 1.0;
          auVar138._4_4_ = auVar232._4_4_ + 1.0;
          auVar138._8_4_ = auVar232._8_4_ + 1.0;
          auVar138._12_4_ = auVar232._12_4_ + 1.0;
          auVar97 = vblendvps_avx(auVar138,auVar174,auVar97);
          auVar108 = vpslld_avx(auVar108,0x1d);
          auVar108 = vpand_avx(auVar108,auVar180);
          *(undefined1 (*) [16])pfVar12 = auVar108 ^ auVar180 ^ auVar97;
          pfVar12 = pfVar12 + 4;
          uVar8 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if ((int)uVar18 < iVar7) {
          uVar9 = CONCAT44(0,~uVar18 + iVar7);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar9;
          auVar20 = vpshufd_avx(auVar32,0x44);
          local_a0._16_16_ = auVar20;
          local_a0._0_16_ = auVar20;
          local_d0 = vpor_avx(auVar20,local_120);
          local_e0 = vpor_avx(auVar20,local_120);
          uVar14 = 0;
          auVar37 = _DAT_0054ed20;
          do {
            auVar33._8_8_ = 0;
            auVar33._0_8_ = uVar14;
            auVar20 = vpshufd_avx(auVar33,0x44);
            auVar52._16_16_ = auVar20;
            auVar52._0_16_ = auVar20;
            auVar46 = vorps_avx(auVar52,_DAT_0054ed00);
            auVar37 = vorps_avx(auVar52,auVar37);
            auVar108 = vpor_avx(local_a0._16_16_,local_120);
            auVar20 = vpcmpgtq_avx(auVar37._16_16_ ^ local_120,auVar108);
            auVar97 = vpcmpgtq_avx(auVar37._0_16_ ^ local_120,local_d0);
            auVar20 = vpackssdw_avx(auVar97,auVar20);
            auVar174 = in_ZMM7._0_16_;
            auVar97 = vpcmpgtq_avx(auVar46._16_16_ ^ local_120,auVar108);
            auVar109._0_4_ = auVar46._0_4_ ^ local_120._0_4_;
            auVar109._4_4_ = auVar46._4_4_ ^ local_120._4_4_;
            auVar109._8_4_ = auVar46._8_4_ ^ local_120._8_4_;
            auVar109._12_4_ = auVar46._12_4_ ^ local_120._12_4_;
            auVar108 = vpcmpgtq_avx(auVar109,local_e0);
            auVar97 = vpackssdw_avx(auVar108,auVar97);
            auVar20 = vpackssdw_avx(auVar97 ^ auVar174,auVar20 ^ auVar174);
            auVar97 = vpmovsxwd_avx(auVar20);
            auVar20 = vpunpckhwd_avx(auVar20,auVar20);
            local_c0._16_16_ = auVar20;
            local_c0._0_16_ = auVar97;
            local_100 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(pfVar12 + uVar14));
            _local_140 = local_100._16_16_;
            local_150._0_4_ = cosf(local_100._16_4_);
            local_150._4_4_ = extraout_XMM0_Db_35;
            local_150._8_4_ = extraout_XMM0_Dc_35;
            local_150._12_4_ = extraout_XMM0_Dd_35;
            auVar20 = vmovshdup_avx(_local_140);
            auVar83._0_4_ = cosf(auVar20._0_4_);
            auVar83._4_60_ = extraout_var_23;
            local_150 = vinsertps_avx(local_150,auVar83._0_16_,0x10);
            auVar20 = vpermilpd_avx(_local_140,1);
            auVar84._0_4_ = cosf(auVar20._0_4_);
            auVar84._4_60_ = extraout_var_24;
            local_150 = vinsertps_avx(local_150,auVar84._0_16_,0x20);
            auVar20 = vpermilps_avx(_local_140,0xff);
            auVar85._0_4_ = cosf(auVar20._0_4_);
            auVar85._4_60_ = extraout_var_25;
            _local_140 = vinsertps_avx(local_150,auVar85._0_16_,0x30);
            local_150._0_4_ = cosf((float)local_100._0_4_);
            local_150._4_4_ = extraout_XMM0_Db_36;
            local_150._8_4_ = extraout_XMM0_Dc_36;
            local_150._12_4_ = extraout_XMM0_Dd_36;
            auVar20 = vmovshdup_avx(local_100._0_16_);
            auVar86._0_4_ = cosf(auVar20._0_4_);
            auVar86._4_60_ = extraout_var_26;
            local_150 = vinsertps_avx(local_150,auVar86._0_16_,0x10);
            auVar20 = vpermilpd_avx(local_100._0_16_,1);
            auVar87._0_4_ = cosf(auVar20._0_4_);
            auVar87._4_60_ = extraout_var_27;
            local_150 = vinsertps_avx(local_150,auVar87._0_16_,0x20);
            auVar20 = vpermilps_avx(local_100._0_16_,0xff);
            auVar88._0_4_ = cosf(auVar20._0_4_);
            auVar37 = _DAT_0054ed20;
            auVar88._4_60_ = extraout_var_28;
            auVar20 = vpcmpeqd_avx(auVar174,auVar174);
            in_ZMM7 = ZEXT1664(auVar20);
            auVar20 = vinsertps_avx(local_150,auVar88._0_16_,0x30);
            auVar53._16_16_ = _local_140;
            auVar53._0_16_ = auVar20;
            auVar46 = vmaskmovps_avx(local_c0,auVar53);
            *(undefined1 (*) [32])(pfVar12 + uVar14) = auVar46;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        local_128 = local_128 + 1;
      } while (local_128 != local_110);
    }
    break;
  case 0xb:
    local_60 = (long)bottom_top_blob->c;
    if (0 < local_60) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_110 = 0;
      local_120._8_8_ = 0x8000000000000000;
      local_120._0_8_ = 0x8000000000000000;
      local_128 = CONCAT44(local_128._4_4_,iVar7);
      do {
        pfVar12 = (float *)(local_108->cstep * local_110 * local_108->elemsize +
                           (long)local_108->data);
        iVar13 = (uint)local_128;
        if (iVar7 < 8) {
          uVar18 = 0;
        }
        else {
          uVar8 = 0;
          do {
            local_80 = *(undefined1 (*) [32])pfVar12;
            UnaryOp_x86_fma_functor::unary_op_tan::func_pack8(&local_151,(__m256 *)local_80);
            *(undefined1 (*) [32])pfVar12 = local_80;
            pfVar12 = pfVar12 + 8;
            uVar18 = uVar8 + 8;
            iVar7 = uVar8 + 0xf;
            uVar8 = uVar18;
          } while (iVar7 < iVar13);
        }
        auVar20 = in_ZMM5._0_16_;
        uVar8 = uVar18 | 3;
        while ((int)uVar8 < iVar13) {
          auVar95 = ZEXT856(*(ulong *)(pfVar12 + 2));
          in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
          local_80._0_16_ = (undefined1  [16])*(__m128 *)pfVar12;
          afVar324 = UnaryOp_x86_fma_functor::unary_op_tan::func_pack4
                               (&local_151,(__m128 *)local_80);
          auVar20 = in_ZMM5._0_16_;
          auVar60._0_8_ = afVar324._0_8_;
          auVar60._8_56_ = auVar95;
          local_80._0_16_ = auVar60._0_16_;
          *(undefined1 (*) [16])pfVar12 = auVar60._0_16_;
          pfVar12 = pfVar12 + 4;
          uVar8 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        auVar20 = vpcmpeqd_avx(auVar20,auVar20);
        in_ZMM5 = ZEXT1664(auVar20);
        if ((int)uVar18 < iVar13) {
          uVar9 = CONCAT44(0,~uVar18 + (uint)local_128);
          auVar23._8_8_ = 0;
          auVar23._0_8_ = uVar9;
          auVar97 = vpshufd_avx(auVar23,0x44);
          auVar20 = vpor_avx(auVar97,local_120);
          local_a0._0_16_ = auVar20;
          local_d0 = vpor_avx(auVar97,local_120);
          local_e0 = vpor_avx(auVar97,local_120);
          uVar14 = 0;
          auVar37 = _DAT_0054ed00;
          auVar46 = _DAT_0054ed20;
          do {
            auVar24._8_8_ = 0;
            auVar24._0_8_ = uVar14;
            auVar20 = vpshufd_avx(auVar24,0x44);
            auVar41._16_16_ = auVar20;
            auVar41._0_16_ = auVar20;
            auVar37 = vorps_avx(auVar41,auVar37);
            auVar46 = vorps_avx(auVar41,auVar46);
            auVar20 = vpcmpgtq_avx(auVar46._16_16_ ^ local_120,local_a0._0_16_);
            auVar97 = vpcmpgtq_avx(auVar46._0_16_ ^ local_120,local_d0);
            auVar20 = vpackssdw_avx(auVar97,auVar20);
            auVar174 = in_ZMM5._0_16_;
            auVar97 = vpcmpgtq_avx(auVar37._16_16_ ^ local_120,local_a0._0_16_);
            auVar100._0_4_ = auVar37._0_4_ ^ local_120._0_4_;
            auVar100._4_4_ = auVar37._4_4_ ^ local_120._4_4_;
            auVar100._8_4_ = auVar37._8_4_ ^ local_120._8_4_;
            auVar100._12_4_ = auVar37._12_4_ ^ local_120._12_4_;
            auVar108 = vpcmpgtq_avx(auVar100,local_e0);
            auVar97 = vpackssdw_avx(auVar108,auVar97);
            auVar20 = vpackssdw_avx(auVar97 ^ auVar174,auVar20 ^ auVar174);
            auVar97 = vpmovsxwd_avx(auVar20);
            auVar20 = vpunpckhwd_avx(auVar20,auVar20);
            local_c0._16_16_ = auVar20;
            local_c0._0_16_ = auVar97;
            local_100 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(pfVar12 + uVar14));
            _local_140 = local_100._16_16_;
            local_150._0_4_ = tanf(local_100._16_4_);
            local_150._4_4_ = extraout_XMM0_Db_09;
            local_150._8_4_ = extraout_XMM0_Dc_09;
            local_150._12_4_ = extraout_XMM0_Dd_09;
            auVar20 = vmovshdup_avx(_local_140);
            auVar61._0_4_ = tanf(auVar20._0_4_);
            auVar61._4_60_ = extraout_var_01;
            local_150 = vinsertps_avx(local_150,auVar61._0_16_,0x10);
            auVar20 = vpermilpd_avx(_local_140,1);
            auVar62._0_4_ = tanf(auVar20._0_4_);
            auVar62._4_60_ = extraout_var_02;
            local_150 = vinsertps_avx(local_150,auVar62._0_16_,0x20);
            auVar20 = vpermilps_avx(_local_140,0xff);
            auVar63._0_4_ = tanf(auVar20._0_4_);
            auVar63._4_60_ = extraout_var_03;
            _local_140 = vinsertps_avx(local_150,auVar63._0_16_,0x30);
            local_150._0_4_ = tanf((float)local_100._0_4_);
            local_150._4_4_ = extraout_XMM0_Db_10;
            local_150._8_4_ = extraout_XMM0_Dc_10;
            local_150._12_4_ = extraout_XMM0_Dd_10;
            auVar20 = vmovshdup_avx(local_100._0_16_);
            auVar64._0_4_ = tanf(auVar20._0_4_);
            auVar64._4_60_ = extraout_var_04;
            local_150 = vinsertps_avx(local_150,auVar64._0_16_,0x10);
            auVar20 = vpermilpd_avx(local_100._0_16_,1);
            auVar65._0_4_ = tanf(auVar20._0_4_);
            auVar65._4_60_ = extraout_var_05;
            local_150 = vinsertps_avx(local_150,auVar65._0_16_,0x20);
            auVar20 = vpermilps_avx(local_100._0_16_,0xff);
            auVar66._0_4_ = tanf(auVar20._0_4_);
            auVar46 = _DAT_0054ed20;
            auVar37 = _DAT_0054ed00;
            auVar66._4_60_ = extraout_var_06;
            auVar20 = vpcmpeqd_avx(auVar174,auVar174);
            in_ZMM5 = ZEXT1664(auVar20);
            auVar20 = vinsertps_avx(local_150,auVar66._0_16_,0x30);
            auVar42._16_16_ = _local_140;
            auVar42._0_16_ = auVar20;
            auVar127 = vmaskmovps_avx(local_c0,auVar42);
            *(undefined1 (*) [32])(pfVar12 + uVar14) = auVar127;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        local_110 = local_110 + 1;
        iVar7 = (uint)local_128;
      } while (local_110 != local_60);
    }
    break;
  case 0xc:
    local_e0._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_128 = CONCAT44(local_128._4_4_,iVar7) & 0xfffffffffffffff8;
      lVar15 = 0;
      do {
        pauVar17 = (undefined1 (*) [16])
                   (local_108->cstep * lVar15 * local_108->elemsize + (long)local_108->data);
        if (iVar7 < 8) {
          uVar18 = 0;
        }
        else {
          iVar13 = 7;
          do {
            local_140._0_4_ = *(float *)(*pauVar17 + 4);
            fVar19 = asinf(*(float *)*pauVar17);
            auVar37 = local_100;
            local_100._4_4_ = extraout_XMM0_Db_11;
            local_100._0_4_ = fVar19;
            local_100._8_4_ = extraout_XMM0_Dc_11;
            local_100._16_16_ = auVar37._16_16_;
            local_100._12_4_ = extraout_XMM0_Dd_11;
            local_140._0_4_ = asinf((float)local_140._0_4_);
            local_140._4_4_ = extraout_XMM0_Db_12;
            uStack_138 = extraout_XMM0_Dc_12;
            uStack_134 = extraout_XMM0_Dd_12;
            fVar19 = asinf(*(float *)(*pauVar17 + 8));
            auVar37 = local_c0;
            local_c0._4_4_ = extraout_XMM0_Db_13;
            local_c0._0_4_ = fVar19;
            local_c0._8_4_ = extraout_XMM0_Dc_13;
            local_c0._16_16_ = auVar37._16_16_;
            local_c0._12_4_ = extraout_XMM0_Dd_13;
            local_150._0_4_ = asinf(*(float *)(*pauVar17 + 0xc));
            local_150._4_4_ = extraout_XMM0_Db_14;
            local_150._8_4_ = extraout_XMM0_Dc_14;
            local_150._12_4_ = extraout_XMM0_Dd_14;
            local_120._0_4_ = asinf(*(float *)pauVar17[1]);
            local_120._4_4_ = extraout_XMM0_Db_15;
            local_120._8_4_ = extraout_XMM0_Dc_15;
            local_120._12_4_ = extraout_XMM0_Dd_15;
            fVar19 = asinf(*(float *)(pauVar17[1] + 4));
            auVar37 = local_a0;
            local_a0._4_4_ = extraout_XMM0_Db_16;
            local_a0._0_4_ = fVar19;
            local_a0._8_4_ = extraout_XMM0_Dc_16;
            local_a0._16_16_ = auVar37._16_16_;
            local_a0._12_4_ = extraout_XMM0_Dd_16;
            local_d0._0_4_ = asinf(*(float *)(pauVar17[1] + 8));
            local_d0._4_4_ = extraout_XMM0_Db_17;
            local_d0._8_4_ = extraout_XMM0_Dc_17;
            local_d0._12_4_ = extraout_XMM0_Dd_17;
            auVar67._0_4_ = asinf(*(float *)(pauVar17[1] + 0xc));
            auVar67._4_60_ = extraout_var_07;
            auVar20 = vinsertps_avx(local_120,ZEXT416((uint)local_a0._0_4_),0x10);
            auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)local_d0._0_4_),0x20);
            auVar20 = vinsertps_avx(auVar20,auVar67._0_16_,0x30);
            auVar97 = vinsertps_avx(local_100._0_16_,ZEXT416((uint)local_140._0_4_),0x10);
            auVar97 = vinsertps_avx(auVar97,ZEXT416((uint)local_c0._0_4_),0x20);
            auVar97 = vinsertps_avx(auVar97,ZEXT416((uint)local_150._0_4_),0x30);
            *pauVar17 = auVar97;
            pauVar17[1] = auVar20;
            pauVar17 = pauVar17 + 2;
            iVar13 = iVar13 + 8;
          } while (iVar13 < iVar7);
          uVar18 = (uint)local_128;
        }
        uVar8 = uVar18 | 3;
        while ((int)uVar8 < iVar7) {
          local_140._0_4_ = *(float *)(*pauVar17 + 4);
          fVar19 = asinf(*(float *)*pauVar17);
          auVar37 = local_100;
          local_100._4_4_ = extraout_XMM0_Db_18;
          local_100._0_4_ = fVar19;
          local_100._8_4_ = extraout_XMM0_Dc_18;
          local_100._16_16_ = auVar37._16_16_;
          local_100._12_4_ = extraout_XMM0_Dd_18;
          local_140._0_4_ = asinf((float)local_140._0_4_);
          local_140._4_4_ = extraout_XMM0_Db_19;
          uStack_138 = extraout_XMM0_Dc_19;
          uStack_134 = extraout_XMM0_Dd_19;
          fVar19 = asinf(*(float *)(*pauVar17 + 8));
          auVar37 = local_c0;
          local_c0._4_4_ = extraout_XMM0_Db_20;
          local_c0._0_4_ = fVar19;
          local_c0._8_4_ = extraout_XMM0_Dc_20;
          local_c0._16_16_ = auVar37._16_16_;
          local_c0._12_4_ = extraout_XMM0_Dd_20;
          auVar68._0_4_ = asinf(*(float *)(*pauVar17 + 0xc));
          auVar68._4_60_ = extraout_var_08;
          auVar20 = vinsertps_avx(local_100._0_16_,ZEXT416((uint)local_140._0_4_),0x10);
          auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)local_c0._0_4_),0x20);
          auVar20 = vinsertps_avx(auVar20,auVar68._0_16_,0x30);
          *pauVar17 = auVar20;
          pauVar17 = pauVar17 + 1;
          uVar8 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if (iVar7 - uVar18 != 0 && (int)uVar18 <= iVar7) {
          lVar11 = 0;
          do {
            fVar19 = asinf(*(float *)(*pauVar17 + lVar11 * 4));
            *(float *)(*pauVar17 + lVar11 * 4) = fVar19;
            lVar11 = lVar11 + 1;
          } while (iVar7 - uVar18 != (int)lVar11);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != local_e0._0_8_);
    }
    break;
  case 0xd:
    local_e0._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_128 = CONCAT44(local_128._4_4_,iVar7) & 0xfffffffffffffff8;
      lVar15 = 0;
      do {
        pauVar17 = (undefined1 (*) [16])
                   (local_108->cstep * lVar15 * local_108->elemsize + (long)local_108->data);
        if (iVar7 < 8) {
          uVar18 = 0;
        }
        else {
          iVar13 = 7;
          do {
            local_140._0_4_ = *(float *)(*pauVar17 + 4);
            fVar19 = acosf(*(float *)*pauVar17);
            auVar37 = local_100;
            local_100._4_4_ = extraout_XMM0_Db_25;
            local_100._0_4_ = fVar19;
            local_100._8_4_ = extraout_XMM0_Dc_25;
            local_100._16_16_ = auVar37._16_16_;
            local_100._12_4_ = extraout_XMM0_Dd_25;
            local_140._0_4_ = acosf((float)local_140._0_4_);
            local_140._4_4_ = extraout_XMM0_Db_26;
            uStack_138 = extraout_XMM0_Dc_26;
            uStack_134 = extraout_XMM0_Dd_26;
            fVar19 = acosf(*(float *)(*pauVar17 + 8));
            auVar37 = local_c0;
            local_c0._4_4_ = extraout_XMM0_Db_27;
            local_c0._0_4_ = fVar19;
            local_c0._8_4_ = extraout_XMM0_Dc_27;
            local_c0._16_16_ = auVar37._16_16_;
            local_c0._12_4_ = extraout_XMM0_Dd_27;
            local_150._0_4_ = acosf(*(float *)(*pauVar17 + 0xc));
            local_150._4_4_ = extraout_XMM0_Db_28;
            local_150._8_4_ = extraout_XMM0_Dc_28;
            local_150._12_4_ = extraout_XMM0_Dd_28;
            local_120._0_4_ = acosf(*(float *)pauVar17[1]);
            local_120._4_4_ = extraout_XMM0_Db_29;
            local_120._8_4_ = extraout_XMM0_Dc_29;
            local_120._12_4_ = extraout_XMM0_Dd_29;
            fVar19 = acosf(*(float *)(pauVar17[1] + 4));
            auVar37 = local_a0;
            local_a0._4_4_ = extraout_XMM0_Db_30;
            local_a0._0_4_ = fVar19;
            local_a0._8_4_ = extraout_XMM0_Dc_30;
            local_a0._16_16_ = auVar37._16_16_;
            local_a0._12_4_ = extraout_XMM0_Dd_30;
            local_d0._0_4_ = acosf(*(float *)(pauVar17[1] + 8));
            local_d0._4_4_ = extraout_XMM0_Db_31;
            local_d0._8_4_ = extraout_XMM0_Dc_31;
            local_d0._12_4_ = extraout_XMM0_Dd_31;
            auVar81._0_4_ = acosf(*(float *)(pauVar17[1] + 0xc));
            auVar81._4_60_ = extraout_var_21;
            auVar20 = vinsertps_avx(local_120,ZEXT416((uint)local_a0._0_4_),0x10);
            auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)local_d0._0_4_),0x20);
            auVar20 = vinsertps_avx(auVar20,auVar81._0_16_,0x30);
            auVar97 = vinsertps_avx(local_100._0_16_,ZEXT416((uint)local_140._0_4_),0x10);
            auVar97 = vinsertps_avx(auVar97,ZEXT416((uint)local_c0._0_4_),0x20);
            auVar97 = vinsertps_avx(auVar97,ZEXT416((uint)local_150._0_4_),0x30);
            *pauVar17 = auVar97;
            pauVar17[1] = auVar20;
            pauVar17 = pauVar17 + 2;
            iVar13 = iVar13 + 8;
          } while (iVar13 < iVar7);
          uVar18 = (uint)local_128;
        }
        uVar8 = uVar18 | 3;
        while ((int)uVar8 < iVar7) {
          local_140._0_4_ = *(float *)(*pauVar17 + 4);
          fVar19 = acosf(*(float *)*pauVar17);
          auVar37 = local_100;
          local_100._4_4_ = extraout_XMM0_Db_32;
          local_100._0_4_ = fVar19;
          local_100._8_4_ = extraout_XMM0_Dc_32;
          local_100._16_16_ = auVar37._16_16_;
          local_100._12_4_ = extraout_XMM0_Dd_32;
          local_140._0_4_ = acosf((float)local_140._0_4_);
          local_140._4_4_ = extraout_XMM0_Db_33;
          uStack_138 = extraout_XMM0_Dc_33;
          uStack_134 = extraout_XMM0_Dd_33;
          fVar19 = acosf(*(float *)(*pauVar17 + 8));
          auVar37 = local_c0;
          local_c0._4_4_ = extraout_XMM0_Db_34;
          local_c0._0_4_ = fVar19;
          local_c0._8_4_ = extraout_XMM0_Dc_34;
          local_c0._16_16_ = auVar37._16_16_;
          local_c0._12_4_ = extraout_XMM0_Dd_34;
          auVar82._0_4_ = acosf(*(float *)(*pauVar17 + 0xc));
          auVar82._4_60_ = extraout_var_22;
          auVar20 = vinsertps_avx(local_100._0_16_,ZEXT416((uint)local_140._0_4_),0x10);
          auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)local_c0._0_4_),0x20);
          auVar20 = vinsertps_avx(auVar20,auVar82._0_16_,0x30);
          *pauVar17 = auVar20;
          pauVar17 = pauVar17 + 1;
          uVar8 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if (iVar7 - uVar18 != 0 && (int)uVar18 <= iVar7) {
          lVar11 = 0;
          do {
            fVar19 = acosf(*(float *)(*pauVar17 + lVar11 * 4));
            *(float *)(*pauVar17 + lVar11 * 4) = fVar19;
            lVar11 = lVar11 + 1;
          } while (iVar7 - uVar18 != (int)lVar11);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != local_e0._0_8_);
    }
    break;
  case 0xe:
    local_e0._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_128 = CONCAT44(local_128._4_4_,iVar7) & 0xfffffffffffffff8;
      lVar15 = 0;
      do {
        pauVar17 = (undefined1 (*) [16])
                   (local_108->cstep * lVar15 * local_108->elemsize + (long)local_108->data);
        if (iVar7 < 8) {
          uVar18 = 0;
        }
        else {
          iVar13 = 7;
          do {
            local_140._0_4_ = *(float *)(*pauVar17 + 4);
            fVar19 = atanf(*(float *)*pauVar17);
            auVar37 = local_100;
            local_100._4_4_ = extraout_XMM0_Db;
            local_100._0_4_ = fVar19;
            local_100._8_4_ = extraout_XMM0_Dc;
            local_100._16_16_ = auVar37._16_16_;
            local_100._12_4_ = extraout_XMM0_Dd;
            local_140._0_4_ = atanf((float)local_140._0_4_);
            local_140._4_4_ = extraout_XMM0_Db_00;
            uStack_138 = extraout_XMM0_Dc_00;
            uStack_134 = extraout_XMM0_Dd_00;
            fVar19 = atanf(*(float *)(*pauVar17 + 8));
            auVar37 = local_c0;
            local_c0._4_4_ = extraout_XMM0_Db_01;
            local_c0._0_4_ = fVar19;
            local_c0._8_4_ = extraout_XMM0_Dc_01;
            local_c0._16_16_ = auVar37._16_16_;
            local_c0._12_4_ = extraout_XMM0_Dd_01;
            local_150._0_4_ = atanf(*(float *)(*pauVar17 + 0xc));
            local_150._4_4_ = extraout_XMM0_Db_02;
            local_150._8_4_ = extraout_XMM0_Dc_02;
            local_150._12_4_ = extraout_XMM0_Dd_02;
            local_120._0_4_ = atanf(*(float *)pauVar17[1]);
            local_120._4_4_ = extraout_XMM0_Db_03;
            local_120._8_4_ = extraout_XMM0_Dc_03;
            local_120._12_4_ = extraout_XMM0_Dd_03;
            fVar19 = atanf(*(float *)(pauVar17[1] + 4));
            auVar37 = local_a0;
            local_a0._4_4_ = extraout_XMM0_Db_04;
            local_a0._0_4_ = fVar19;
            local_a0._8_4_ = extraout_XMM0_Dc_04;
            local_a0._16_16_ = auVar37._16_16_;
            local_a0._12_4_ = extraout_XMM0_Dd_04;
            local_d0._0_4_ = atanf(*(float *)(pauVar17[1] + 8));
            local_d0._4_4_ = extraout_XMM0_Db_05;
            local_d0._8_4_ = extraout_XMM0_Dc_05;
            local_d0._12_4_ = extraout_XMM0_Dd_05;
            auVar57._0_4_ = atanf(*(float *)(pauVar17[1] + 0xc));
            auVar57._4_60_ = extraout_var;
            auVar20 = vinsertps_avx(local_120,ZEXT416((uint)local_a0._0_4_),0x10);
            auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)local_d0._0_4_),0x20);
            auVar20 = vinsertps_avx(auVar20,auVar57._0_16_,0x30);
            auVar97 = vinsertps_avx(local_100._0_16_,ZEXT416((uint)local_140._0_4_),0x10);
            auVar97 = vinsertps_avx(auVar97,ZEXT416((uint)local_c0._0_4_),0x20);
            auVar97 = vinsertps_avx(auVar97,ZEXT416((uint)local_150._0_4_),0x30);
            *pauVar17 = auVar97;
            pauVar17[1] = auVar20;
            pauVar17 = pauVar17 + 2;
            iVar13 = iVar13 + 8;
          } while (iVar13 < iVar7);
          uVar18 = (uint)local_128;
        }
        uVar8 = uVar18 | 3;
        while ((int)uVar8 < iVar7) {
          local_140._0_4_ = *(float *)(*pauVar17 + 4);
          fVar19 = atanf(*(float *)*pauVar17);
          auVar37 = local_100;
          local_100._4_4_ = extraout_XMM0_Db_06;
          local_100._0_4_ = fVar19;
          local_100._8_4_ = extraout_XMM0_Dc_06;
          local_100._16_16_ = auVar37._16_16_;
          local_100._12_4_ = extraout_XMM0_Dd_06;
          local_140._0_4_ = atanf((float)local_140._0_4_);
          local_140._4_4_ = extraout_XMM0_Db_07;
          uStack_138 = extraout_XMM0_Dc_07;
          uStack_134 = extraout_XMM0_Dd_07;
          fVar19 = atanf(*(float *)(*pauVar17 + 8));
          auVar37 = local_c0;
          local_c0._4_4_ = extraout_XMM0_Db_08;
          local_c0._0_4_ = fVar19;
          local_c0._8_4_ = extraout_XMM0_Dc_08;
          local_c0._16_16_ = auVar37._16_16_;
          local_c0._12_4_ = extraout_XMM0_Dd_08;
          auVar59._0_4_ = atanf(*(float *)(*pauVar17 + 0xc));
          auVar59._4_60_ = extraout_var_00;
          auVar20 = vinsertps_avx(local_100._0_16_,ZEXT416((uint)local_140._0_4_),0x10);
          auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)local_c0._0_4_),0x20);
          auVar20 = vinsertps_avx(auVar20,auVar59._0_16_,0x30);
          *pauVar17 = auVar20;
          pauVar17 = pauVar17 + 1;
          uVar8 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if (iVar7 - uVar18 != 0 && (int)uVar18 <= iVar7) {
          lVar11 = 0;
          do {
            fVar19 = atanf(*(float *)(*pauVar17 + lVar11 * 4));
            *(float *)(*pauVar17 + lVar11 * 4) = fVar19;
            lVar11 = lVar11 + 1;
          } while (iVar7 - uVar18 != (int)lVar11);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != local_e0._0_8_);
    }
    break;
  case 0xf:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar15 = 0;
      auVar45._8_4_ = 0x3f800000;
      auVar45._0_8_ = 0x3f8000003f800000;
      auVar45._12_4_ = 0x3f800000;
      auVar45._16_4_ = 0x3f800000;
      auVar45._20_4_ = 0x3f800000;
      auVar45._24_4_ = 0x3f800000;
      auVar45._28_4_ = 0x3f800000;
      auVar105._8_4_ = 0x3f800000;
      auVar105._0_8_ = 0x3f8000003f800000;
      auVar105._12_4_ = 0x3f800000;
      auVar150._8_8_ = 0x8000000000000000;
      auVar150._0_8_ = 0x8000000000000000;
      auVar20 = vpcmpeqd_avx(auVar97,auVar97);
      do {
        pauVar16 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar18 < 8) {
          uVar8 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar127 = vrcpps_avx(*pauVar16);
            auVar97 = vfmsub213ps_fma(*pauVar16,auVar127,auVar45);
            auVar97 = vfnmadd132ps_fma(ZEXT1632(auVar97),auVar127,auVar127);
            *pauVar16 = ZEXT1632(auVar97);
            pauVar16 = pauVar16 + 1;
            iVar13 = iVar13 + 8;
            uVar8 = uVar18 & 0xfffffff8;
          } while (iVar13 < (int)uVar18);
        }
        uVar10 = uVar8 | 3;
        while ((int)uVar10 < (int)uVar18) {
          auVar97 = vrcpps_avx(*(undefined1 (*) [16])*pauVar16);
          auVar108 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar16,auVar97,auVar105);
          auVar97 = vfnmadd132ps_fma(auVar108,auVar97,auVar97);
          *(undefined1 (*) [16])*pauVar16 = auVar97;
          pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
          uVar10 = uVar8 + 7;
          uVar8 = uVar8 + 4;
        }
        if ((int)uVar8 < (int)uVar18) {
          uVar9 = CONCAT44(0,~uVar8 + uVar18);
          auVar188._8_8_ = 0;
          auVar188._0_8_ = uVar9;
          auVar174 = vpshufd_avx(auVar188,0x44);
          auVar97 = vorps_avx(auVar174,auVar150);
          auVar108 = vorps_avx(auVar174,auVar150);
          auVar174 = vorps_avx(auVar174,auVar150);
          uVar14 = 0;
          do {
            auVar238._8_8_ = 0;
            auVar238._0_8_ = uVar14;
            auVar222 = vpshufd_avx(auVar238,0x44);
            auVar250._16_16_ = auVar222;
            auVar250._0_16_ = auVar222;
            auVar127 = vorps_avx(auVar250,auVar37);
            auVar140 = vorps_avx(auVar250,auVar46);
            auVar275._0_8_ = auVar140._16_8_ ^ 0x8000000000000000;
            auVar275._8_4_ = auVar140._24_4_;
            auVar275._12_4_ = auVar140._28_4_ ^ 0x80000000;
            auVar222 = vpcmpgtq_avx(auVar275,auVar97);
            auVar239._0_8_ = auVar140._0_8_ ^ 0x8000000000000000;
            auVar239._8_4_ = auVar140._8_4_;
            auVar239._12_4_ = auVar140._12_4_ ^ 0x80000000;
            auVar232 = vpcmpgtq_avx(auVar239,auVar108);
            auVar222 = vpackssdw_avx(auVar232,auVar222);
            auVar276._0_8_ = auVar127._16_8_ ^ 0x8000000000000000;
            auVar276._8_4_ = auVar127._24_4_;
            auVar276._12_4_ = auVar127._28_4_ ^ 0x80000000;
            auVar232 = vpcmpgtq_avx(auVar276,auVar97);
            auVar262._0_8_ = auVar127._0_8_ ^ 0x8000000000000000;
            auVar262._8_4_ = auVar127._8_4_;
            auVar262._12_4_ = auVar127._12_4_ ^ 0x80000000;
            auVar260 = vpcmpgtq_avx(auVar262,auVar174);
            auVar232 = vpackssdw_avx(auVar260,auVar232);
            auVar222 = vpackssdw_avx(auVar232 ^ auVar20,auVar222 ^ auVar20);
            auVar232 = vpmovsxwd_avx(auVar222);
            auVar222 = vpunpckhwd_avx(auVar222,auVar222);
            auVar251._16_16_ = auVar222;
            auVar251._0_16_ = auVar232;
            auVar140 = vmaskmovps_avx(auVar251,*(undefined1 (*) [32])(*pauVar16 + uVar14 * 4));
            auVar127 = vrcpps_avx(auVar140);
            auVar222 = vfmsub213ps_fma(auVar140,auVar127,auVar45);
            auVar222 = vfnmadd132ps_fma(ZEXT1632(auVar222),auVar127,auVar127);
            auVar127 = vmaskmovps_avx(auVar251,ZEXT1632(auVar222));
            *(undefined1 (*) [32])(*pauVar16 + uVar14 * 4) = auVar127;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar7);
    }
    break;
  case 0x10:
    local_100._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      uVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_140._0_4_ = uVar18 & 0xfffffff8;
      lVar15 = 0;
      do {
        auVar293._8_4_ = 0x395e8083;
        auVar293._0_8_ = 0x395e8083395e8083;
        auVar269._8_4_ = 0x3f318000;
        auVar269._0_8_ = 0x3f3180003f318000;
        auVar249._8_4_ = 0x3f800000;
        auVar249._0_8_ = 0x3f8000003f800000;
        auVar213._8_4_ = 0x3f000000;
        auVar213._0_8_ = 0x3f0000003f000000;
        auVar197._8_4_ = 0x3d2aa9c1;
        auVar197._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar182._8_4_ = 0x3c088908;
        auVar182._0_8_ = 0x3c0889083c088908;
        auVar164._8_4_ = 0xc0000000;
        auVar164._0_8_ = 0xc0000000c0000000;
        auVar140._8_4_ = 0x3fb8aa3b;
        auVar140._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar127._8_4_ = 0xc2b0c0a5;
        auVar127._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar46._8_4_ = 0x42b0c0a5;
        auVar46._0_8_ = 0x42b0c0a542b0c0a5;
        auVar37._8_4_ = 0x39506967;
        auVar37._0_8_ = 0x3950696739506967;
        auVar293._12_4_ = 0x395e8083;
        auVar269._12_4_ = 0x3f318000;
        auVar249._12_4_ = 0x3f800000;
        auVar213._12_4_ = 0x3f000000;
        auVar197._12_4_ = 0x3d2aa9c1;
        auVar182._12_4_ = 0x3c088908;
        auVar164._12_4_ = 0xc0000000;
        auVar140._12_4_ = 0x3fb8aa3b;
        auVar127._12_4_ = 0xc2b0c0a5;
        auVar46._12_4_ = 0x42b0c0a5;
        auVar37._12_4_ = 0x39506967;
        auVar293._16_4_ = 0x395e8083;
        auVar269._16_4_ = 0x3f318000;
        auVar249._16_4_ = 0x3f800000;
        auVar213._16_4_ = 0x3f000000;
        auVar197._16_4_ = 0x3d2aa9c1;
        auVar182._16_4_ = 0x3c088908;
        auVar164._16_4_ = 0xc0000000;
        auVar140._16_4_ = 0x3fb8aa3b;
        auVar127._16_4_ = 0xc2b0c0a5;
        auVar46._16_4_ = 0x42b0c0a5;
        auVar37._16_4_ = 0x39506967;
        auVar293._20_4_ = 0x395e8083;
        auVar269._20_4_ = 0x3f318000;
        auVar249._20_4_ = 0x3f800000;
        auVar213._20_4_ = 0x3f000000;
        auVar197._20_4_ = 0x3d2aa9c1;
        auVar182._20_4_ = 0x3c088908;
        auVar164._20_4_ = 0xc0000000;
        auVar140._20_4_ = 0x3fb8aa3b;
        auVar127._20_4_ = 0xc2b0c0a5;
        auVar46._20_4_ = 0x42b0c0a5;
        auVar37._20_4_ = 0x39506967;
        auVar293._24_4_ = 0x395e8083;
        auVar269._24_4_ = 0x3f318000;
        auVar249._24_4_ = 0x3f800000;
        auVar213._24_4_ = 0x3f000000;
        auVar197._24_4_ = 0x3d2aa9c1;
        auVar182._24_4_ = 0x3c088908;
        auVar164._24_4_ = 0xc0000000;
        auVar140._24_4_ = 0x3fb8aa3b;
        auVar127._24_4_ = 0xc2b0c0a5;
        auVar46._24_4_ = 0x42b0c0a5;
        auVar37._24_4_ = 0x39506967;
        auVar293._28_4_ = 0x395e8083;
        auVar269._28_4_ = 0x3f318000;
        auVar249._28_4_ = 0x3f800000;
        auVar213._28_4_ = 0x3f000000;
        auVar197._28_4_ = 0x3d2aa9c1;
        auVar182._28_4_ = 0x3c088908;
        auVar164._28_4_ = 0xc0000000;
        auVar140._28_4_ = 0x3fb8aa3b;
        auVar127._28_4_ = 0xc2b0c0a5;
        auVar46._28_4_ = 0x42b0c0a5;
        auVar37._28_4_ = 0x39506967;
        auVar57 = ZEXT3264(auVar37);
        pauVar16 = (undefined1 (*) [32])
                   (local_108->cstep * lVar15 * local_108->elemsize + (long)local_108->data);
        if ((int)uVar18 < 8) {
          uVar8 = 0;
        }
        else {
          iVar7 = 7;
          do {
            auVar58._0_4_ = *(float *)*pauVar16 * -2.0;
            auVar58._4_4_ = *(float *)((long)*pauVar16 + 4) * -2.0;
            auVar58._8_4_ = *(float *)((long)*pauVar16 + 8) * -2.0;
            auVar58._12_4_ = *(float *)((long)*pauVar16 + 0xc) * -2.0;
            auVar58._16_4_ = *(float *)((long)*pauVar16 + 0x10) * -2.0;
            auVar58._20_4_ = *(float *)((long)*pauVar16 + 0x14) * -2.0;
            auVar58._28_36_ = auVar57._28_36_;
            auVar58._24_4_ = *(float *)((long)*pauVar16 + 0x18) * -2.0;
            auVar40 = vminps_avx(auVar58._0_32_,auVar46);
            auVar1 = vmaxps_avx(auVar40,auVar127);
            auVar20 = vfmadd213ps_fma(auVar140,auVar1,auVar213);
            auVar39 = vroundps_avx(ZEXT1632(auVar20),1);
            auVar40 = vcmpps_avx(ZEXT1632(auVar20),auVar39,1);
            auVar40 = vandps_avx(auVar249,auVar40);
            auVar40 = vsubps_avx(auVar39,auVar40);
            auVar20 = vfmsub231ps_fma(auVar1,auVar40,auVar269);
            auVar97 = vfmsub231ps_fma(ZEXT1632(auVar20),auVar40,auVar293);
            auVar38 = ZEXT1632(auVar97);
            auVar1._28_4_ = auVar39._28_4_;
            auVar1._0_28_ =
                 ZEXT1628(CONCAT412(auVar97._12_4_ * auVar97._12_4_,
                                    CONCAT48(auVar97._8_4_ * auVar97._8_4_,
                                             CONCAT44(auVar97._4_4_ * auVar97._4_4_,
                                                      auVar97._0_4_ * auVar97._0_4_))));
            auVar301._8_4_ = 0x3ab743ce;
            auVar301._0_8_ = 0x3ab743ce3ab743ce;
            auVar301._12_4_ = 0x3ab743ce;
            auVar301._16_4_ = 0x3ab743ce;
            auVar301._20_4_ = 0x3ab743ce;
            auVar301._24_4_ = 0x3ab743ce;
            auVar301._28_4_ = 0x3ab743ce;
            auVar20 = vfmadd213ps_fma(auVar37,auVar38,auVar301);
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar38,auVar182);
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar38,auVar197);
            auVar302._8_4_ = 0x3e2aaaaa;
            auVar302._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar302._12_4_ = 0x3e2aaaaa;
            auVar302._16_4_ = 0x3e2aaaaa;
            auVar302._20_4_ = 0x3e2aaaaa;
            auVar302._24_4_ = 0x3e2aaaaa;
            auVar302._28_4_ = 0x3e2aaaaa;
            auVar39 = ZEXT1632(auVar97);
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar39,auVar302);
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar39,auVar213);
            auVar108 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar1,auVar39);
            auVar20._0_4_ = (int)auVar40._0_4_;
            auVar20._4_4_ = (int)auVar40._4_4_;
            auVar20._8_4_ = (int)auVar40._8_4_;
            auVar20._12_4_ = (int)auVar40._12_4_;
            auVar39._16_4_ = (int)auVar40._16_4_;
            auVar39._0_16_ = auVar20;
            auVar39._20_4_ = (int)auVar40._20_4_;
            auVar39._24_4_ = (int)auVar40._24_4_;
            auVar39._28_4_ = (int)auVar40._28_4_;
            auVar97 = vpslld_avx(auVar20,0x17);
            auVar20 = vpslld_avx(auVar39._16_16_,0x17);
            auVar174._8_4_ = 0x3f800000;
            auVar174._0_8_ = 0x3f8000003f800000;
            auVar174._12_4_ = 0x3f800000;
            auVar20 = vpaddd_avx(auVar174,auVar20);
            auVar97 = vpaddd_avx(auVar174,auVar97);
            auVar40._16_16_ = auVar20;
            auVar40._0_16_ = auVar97;
            auVar38._0_4_ = auVar108._0_4_ + 1.0;
            auVar38._4_4_ = auVar108._4_4_ + 1.0;
            auVar38._8_4_ = auVar108._8_4_ + 1.0;
            auVar38._12_4_ = auVar108._12_4_ + 1.0;
            auVar38._16_4_ = 0x3f800000;
            auVar38._20_4_ = 0x3f800000;
            auVar38._24_4_ = 0x3f800000;
            auVar38._28_4_ = 0x3f800000;
            auVar20 = vfmadd213ps_fma(auVar40,auVar38,auVar249);
            auVar40 = vrcpps_avx(ZEXT1632(auVar20));
            auVar20 = vfmsub213ps_fma(ZEXT1632(auVar20),auVar40,auVar249);
            auVar20 = vfnmadd132ps_fma(ZEXT1632(auVar20),auVar40,auVar40);
            auVar20 = vfnmsub213ps_fma(ZEXT1632(auVar20),auVar164,auVar249);
            auVar57 = ZEXT1664(auVar20);
            *pauVar16 = ZEXT1632(auVar20);
            pauVar16 = pauVar16 + 1;
            iVar7 = iVar7 + 8;
          } while (iVar7 < (int)uVar18);
          uVar8 = local_140._0_4_;
        }
        auVar97._8_4_ = 0x3f800000;
        auVar97._0_8_ = 0x3f8000003f800000;
        auVar97._12_4_ = 0x3f800000;
        auVar108._8_4_ = 0xc2b0c0a5;
        auVar108._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar108._12_4_ = 0xc2b0c0a5;
        auVar222._8_4_ = 0x3fb8aa3b;
        auVar222._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar222._12_4_ = 0x3fb8aa3b;
        auVar232._8_4_ = 0x3f000000;
        auVar232._0_8_ = 0x3f0000003f000000;
        auVar232._12_4_ = 0x3f000000;
        auVar260._8_4_ = 0x3f318000;
        auVar260._0_8_ = 0x3f3180003f318000;
        auVar260._12_4_ = 0x3f318000;
        auVar273._8_4_ = 0x395e8083;
        auVar273._0_8_ = 0x395e8083395e8083;
        auVar273._12_4_ = 0x395e8083;
        auVar288._8_4_ = 0x3ab743ce;
        auVar288._0_8_ = 0x3ab743ce3ab743ce;
        auVar288._12_4_ = 0x3ab743ce;
        auVar295._8_4_ = 0x39506967;
        auVar295._0_8_ = 0x3950696739506967;
        auVar295._12_4_ = 0x39506967;
        auVar305._8_4_ = 0x3c088908;
        auVar305._0_8_ = 0x3c0889083c088908;
        auVar305._12_4_ = 0x3c088908;
        auVar312._8_4_ = 0x3d2aa9c1;
        auVar312._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar312._12_4_ = 0x3d2aa9c1;
        uVar10 = uVar8 | 3;
        while ((int)uVar10 < (int)uVar18) {
          auVar21._0_4_ = *(float *)*pauVar16 * -2.0;
          auVar21._4_4_ = *(float *)((long)*pauVar16 + 4) * -2.0;
          auVar21._8_4_ = *(float *)((long)*pauVar16 + 8) * -2.0;
          auVar21._12_4_ = *(float *)((long)*pauVar16 + 0xc) * -2.0;
          auVar98._8_4_ = 0x42b0c0a5;
          auVar98._0_8_ = 0x42b0c0a542b0c0a5;
          auVar98._12_4_ = 0x42b0c0a5;
          auVar20 = vminps_avx(auVar21,auVar98);
          auVar21 = vmaxps_avx(auVar20,auVar108);
          auVar20 = vfmadd213ps_fma(auVar222,auVar21,auVar232);
          auVar113._0_4_ = (int)auVar20._0_4_;
          auVar113._4_4_ = (int)auVar20._4_4_;
          auVar113._8_4_ = (int)auVar20._8_4_;
          auVar113._12_4_ = (int)auVar20._12_4_;
          auVar174 = vcvtdq2ps_avx(auVar113);
          auVar20 = vcmpps_avx(auVar20,auVar174,1);
          auVar20 = vandps_avx(auVar20,auVar97);
          auVar20 = vsubps_avx(auVar174,auVar20);
          auVar174 = vfmsub231ps_fma(auVar21,auVar20,auVar260);
          auVar21 = vfmsub231ps_fma(auVar174,auVar20,auVar273);
          auVar114._0_4_ = auVar21._0_4_ * auVar21._0_4_;
          auVar114._4_4_ = auVar21._4_4_ * auVar21._4_4_;
          auVar114._8_4_ = auVar21._8_4_ * auVar21._8_4_;
          auVar114._12_4_ = auVar21._12_4_ * auVar21._12_4_;
          auVar174 = vfmadd213ps_fma(auVar295,auVar21,auVar288);
          auVar174 = vfmadd213ps_fma(auVar174,auVar21,auVar305);
          auVar174 = vfmadd213ps_fma(auVar174,auVar21,auVar312);
          auVar185._8_4_ = 0x3e2aaaaa;
          auVar185._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar185._12_4_ = 0x3e2aaaaa;
          auVar174 = vfmadd213ps_fma(auVar174,auVar21,auVar185);
          auVar174 = vfmadd213ps_fma(auVar174,auVar21,auVar232);
          auVar174 = vfmadd213ps_fma(auVar174,auVar114,auVar21);
          auVar22._0_4_ = auVar174._0_4_ + 1.0;
          auVar22._4_4_ = auVar174._4_4_ + 1.0;
          auVar22._8_4_ = auVar174._8_4_ + 1.0;
          auVar22._12_4_ = auVar174._12_4_ + 1.0;
          auVar99._0_4_ = (int)auVar20._0_4_;
          auVar99._4_4_ = (int)auVar20._4_4_;
          auVar99._8_4_ = (int)auVar20._8_4_;
          auVar99._12_4_ = (int)auVar20._12_4_;
          auVar20 = vpslld_avx(auVar99,0x17);
          auVar20 = vpaddd_avx(auVar20,auVar97);
          auVar174 = vfmadd213ps_fma(auVar20,auVar22,auVar97);
          auVar20 = vrcpps_avx(auVar174);
          auVar115._0_4_ = auVar20._0_4_ + auVar20._0_4_;
          auVar115._4_4_ = auVar20._4_4_ + auVar20._4_4_;
          auVar115._8_4_ = auVar20._8_4_ + auVar20._8_4_;
          auVar115._12_4_ = auVar20._12_4_ + auVar20._12_4_;
          auVar132._8_4_ = 0x40000000;
          auVar132._0_8_ = 0x4000000040000000;
          auVar132._12_4_ = 0x40000000;
          auVar174 = vfmsub213ps_fma(auVar174,auVar115,auVar132);
          auVar20 = vfnmadd213ps_fma(auVar174,auVar20,auVar115);
          *(float *)*pauVar16 = auVar20._0_4_ + -1.0;
          *(float *)((long)*pauVar16 + 4) = auVar20._4_4_ + -1.0;
          *(float *)((long)*pauVar16 + 8) = auVar20._8_4_ + -1.0;
          *(float *)((long)*pauVar16 + 0xc) = auVar20._12_4_ + -1.0;
          pauVar16 = (undefined1 (*) [32])((long)*pauVar16 + 0x10);
          uVar10 = uVar8 + 7;
          uVar8 = uVar8 + 4;
        }
        if (uVar18 - uVar8 != 0 && (int)uVar8 <= (int)uVar18) {
          lVar11 = 0;
          do {
            fVar19 = tanhf(*(float *)((long)*pauVar16 + lVar11 * 4));
            *(float *)((long)*pauVar16 + lVar11 * 4) = fVar19;
            lVar11 = lVar11 + 1;
          } while (uVar18 - uVar8 != (int)lVar11);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != local_100._0_8_);
    }
  }
  return 0;
}

Assistant:

int UnaryOp_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace UnaryOp_x86_fma_functor;
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    return 0;
}